

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

uchar * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  stbi_uc *psVar1;
  uchar uVar2;
  short sVar3;
  stbi__uint32 sVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  stbi_uc sVar8;
  byte bVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  stbi__uint32 sVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  void *pvVar23;
  uchar *puVar24;
  stbi_uc *psVar25;
  stbi__context *data_00;
  float *data_01;
  stbi_uc *psVar26;
  byte *pbVar27;
  stbi__context *psVar28;
  byte bVar29;
  undefined1 uVar30;
  int iVar31;
  int iVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  ulong uVar36;
  uint uVar37;
  undefined1 auVar38 [8];
  int *piVar39;
  short *data_02;
  int iVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  uchar *puVar44;
  ulong uVar45;
  short sVar46;
  int *piVar47;
  stbi__uint32 z;
  uint uVar48;
  long lVar49;
  size_t sVar50;
  uint uVar51;
  code *pcVar52;
  bool bVar53;
  bool bVar54;
  undefined1 local_4a38 [8];
  stbi__jpeg j;
  short local_1d8 [4];
  short data [64];
  stbi_uc *local_118;
  stbi_uc *coutput [4];
  uint local_c4;
  uint local_c0;
  int local_bc;
  int local_a4;
  int local_a0;
  int local_84;
  uint local_78;
  stbi__context *local_60;
  uint local_58;
  stbi__int16 *local_48;
  uint local_40;
  
  j._18272_8_ = stbi__idct_block;
  j.idct_block_kernel = stbi__YCbCr_to_RGB_row;
  pcVar52 = stbi__resample_row_hv_2;
  j.YCbCr_to_RGB_kernel = stbi__resample_row_hv_2;
  j.code_buffer._0_1_ = 0xff;
  local_4a38 = (undefined1  [8])s;
  sVar8 = stbi__get_marker((stbi__jpeg *)local_4a38);
  if (sVar8 != 0xd8) {
    stbi__g_failure_reason = "no SOI";
  }
  s->img_buffer = s->img_buffer_original;
  if (sVar8 == 0xd8) {
    j._18272_8_ = stbi__idct_block;
    j.idct_block_kernel = stbi__YCbCr_to_RGB_row;
    j.YCbCr_to_RGB_kernel = stbi__resample_row_hv_2;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      lVar21 = 0x45d8;
      do {
        psVar25 = j.huff_dc[0].fast + lVar21 + -0x10;
        psVar25[0] = '\0';
        psVar25[1] = '\0';
        psVar25[2] = '\0';
        psVar25[3] = '\0';
        psVar25[4] = '\0';
        psVar25[5] = '\0';
        psVar25[6] = '\0';
        psVar25[7] = '\0';
        psVar25 = j.huff_dc[0].fast + lVar21 + -8;
        psVar25[0] = '\0';
        psVar25[1] = '\0';
        psVar25[2] = '\0';
        psVar25[3] = '\0';
        psVar25[4] = '\0';
        psVar25[5] = '\0';
        psVar25[6] = '\0';
        psVar25[7] = '\0';
        lVar21 = lVar21 + 0x60;
      } while (lVar21 != 0x4758);
      j.order[2] = 0;
      local_4a38 = (undefined1  [8])s;
      iVar11 = stbi__decode_jpeg_header((stbi__jpeg *)local_4a38,0);
      do {
        if (iVar11 == 0) {
LAB_00114d2b:
          stbi__cleanup_jpeg((stbi__jpeg *)local_4a38);
          return (uchar *)0x0;
        }
LAB_00112e82:
        bVar9 = stbi__get_marker((stbi__jpeg *)local_4a38);
        if (bVar9 == 0xda) {
          iVar11 = stbi__get16be((stbi__context *)local_4a38);
          auVar38 = local_4a38;
          pbVar27 = *(stbi_uc **)((long)local_4a38 + 0xb8);
          if (pbVar27 < *(stbi_uc **)((long)local_4a38 + 0xc0)) {
LAB_00112f14:
            *(byte **)((long)auVar38 + 0xb8) = pbVar27 + 1;
            bVar9 = *pbVar27;
          }
          else {
            if (*(int *)((long)local_4a38 + 0x30) != 0) {
              pcVar52 = (code *)((long)local_4a38 + 0x38);
              iVar12 = (*((stbi_io_callbacks *)((long)local_4a38 + 0x10))->read)
                                 (*(void **)((long)local_4a38 + 0x28),(char *)pcVar52,
                                  *(int *)((long)local_4a38 + 0x34));
              if (iVar12 == 0) {
                *(int *)((long)auVar38 + 0x30) = 0;
                *(code **)((long)auVar38 + 0xb8) = pcVar52;
                *(stbi_uc **)((long)auVar38 + 0xc0) = (stbi_uc *)((long)auVar38 + 0x38) + 1;
                *(stbi_uc *)((long)auVar38 + 0x38) = '\0';
              }
              else {
                *(code **)((long)auVar38 + 0xb8) = pcVar52;
                *(stbi_uc **)((long)auVar38 + 0xc0) = (stbi_uc *)pcVar52 + iVar12;
              }
              pbVar27 = *(stbi_uc **)((long)auVar38 + 0xb8);
              goto LAB_00112f14;
            }
            bVar9 = 0;
          }
          j.succ_low = (uint)bVar9;
          if (((byte)(bVar9 - 5) < 0xfc) || (*(int *)((long)local_4a38 + 8) < (int)(uint)bVar9)) {
            stbi__g_failure_reason = "bad SOS component count";
          }
          else {
            if (iVar11 == (uint)bVar9 * 2 + 6) {
              if (bVar9 != 0) {
                lVar21 = 0;
                do {
                  auVar38 = local_4a38;
                  pbVar27 = *(stbi_uc **)((long)local_4a38 + 0xb8);
                  if (pbVar27 < *(stbi_uc **)((long)local_4a38 + 0xc0)) {
LAB_00112fd5:
                    *(byte **)((long)auVar38 + 0xb8) = pbVar27 + 1;
                    pcVar52 = (code *)(ulong)*pbVar27;
                  }
                  else {
                    if (*(int *)((long)local_4a38 + 0x30) != 0) {
                      psVar25 = (stbi_uc *)((long)local_4a38 + 0x38);
                      iVar11 = (*((stbi_io_callbacks *)((long)local_4a38 + 0x10))->read)
                                         (*(void **)((long)local_4a38 + 0x28),(char *)psVar25,
                                          *(int *)((long)local_4a38 + 0x34));
                      if (iVar11 == 0) {
                        *(int *)((long)auVar38 + 0x30) = 0;
                        *(stbi_uc **)((long)auVar38 + 0xb8) = psVar25;
                        *(stbi_uc **)((long)auVar38 + 0xc0) = (stbi_uc *)((long)auVar38 + 0x38) + 1;
                        *(stbi_uc *)((long)auVar38 + 0x38) = '\0';
                      }
                      else {
                        *(stbi_uc **)((long)auVar38 + 0xb8) = psVar25;
                        *(stbi_uc **)((long)auVar38 + 0xc0) = psVar25 + iVar11;
                      }
                      pbVar27 = *(stbi_uc **)((long)auVar38 + 0xb8);
                      goto LAB_00112fd5;
                    }
                    pcVar52 = (code *)0x0;
                  }
                  auVar38 = local_4a38;
                  pbVar27 = *(stbi_uc **)((long)local_4a38 + 0xb8);
                  if (pbVar27 < *(stbi_uc **)((long)local_4a38 + 0xc0)) {
LAB_00113067:
                    *(byte **)((long)auVar38 + 0xb8) = pbVar27 + 1;
                    bVar9 = *pbVar27;
                  }
                  else {
                    if (*(int *)((long)local_4a38 + 0x30) != 0) {
                      psVar25 = (stbi_uc *)((long)local_4a38 + 0x38);
                      iVar11 = (*((stbi_io_callbacks *)((long)local_4a38 + 0x10))->read)
                                         (*(void **)((long)local_4a38 + 0x28),(char *)psVar25,
                                          *(int *)((long)local_4a38 + 0x34));
                      if (iVar11 == 0) {
                        *(int *)((long)auVar38 + 0x30) = 0;
                        *(stbi_uc **)((long)auVar38 + 0xb8) = psVar25;
                        *(stbi_uc **)((long)auVar38 + 0xc0) = (stbi_uc *)((long)auVar38 + 0x38) + 1;
                        *(stbi_uc *)((long)auVar38 + 0x38) = '\0';
                      }
                      else {
                        *(stbi_uc **)((long)auVar38 + 0xb8) = psVar25;
                        *(stbi_uc **)((long)auVar38 + 0xc0) = psVar25 + iVar11;
                      }
                      pbVar27 = *(stbi_uc **)((long)auVar38 + 0xb8);
                      goto LAB_00113067;
                    }
                    bVar9 = 0;
                  }
                  uVar37 = *(int *)((long)local_4a38 + 8);
                  if ((int)uVar37 < 1) {
                    uVar22 = 0;
                  }
                  else {
                    uVar22 = 0;
                    piVar39 = &j.img_mcu_w;
                    do {
                      if (*piVar39 == (int)pcVar52) goto LAB_0011309f;
                      uVar22 = uVar22 + 1;
                      piVar39 = piVar39 + 0x18;
                    } while (uVar37 != uVar22);
                    uVar22 = (ulong)uVar37;
                  }
LAB_0011309f:
                  if ((uint)uVar22 == uVar37) goto LAB_00114d2b;
                  j.img_comp[uVar22 & 0xffffffff].v = (uint)(bVar9 >> 4);
                  if (0x3f < bVar9) {
                    stbi__g_failure_reason = "bad DC huff";
                    goto LAB_00114d2b;
                  }
                  j.img_comp[uVar22 & 0xffffffff].tq = bVar9 & 0xf;
                  if (3 < (bVar9 & 0xf)) {
                    stbi__g_failure_reason = "bad AC huff";
                    goto LAB_00114d2b;
                  }
                  j.order[lVar21 + -2] = (uint)uVar22;
                  lVar21 = lVar21 + 1;
                } while (lVar21 < j.succ_low);
              }
              auVar38 = local_4a38;
              pbVar27 = *(stbi_uc **)((long)local_4a38 + 0xb8);
              if (pbVar27 < *(stbi_uc **)((long)local_4a38 + 0xc0)) {
LAB_00113162:
                *(byte **)((long)auVar38 + 0xb8) = pbVar27 + 1;
                j.nomore = (int)*pbVar27;
              }
              else {
                if (*(int *)((long)local_4a38 + 0x30) != 0) {
                  psVar25 = (stbi_uc *)((long)local_4a38 + 0x38);
                  iVar11 = (*((stbi_io_callbacks *)((long)local_4a38 + 0x10))->read)
                                     (*(void **)((long)local_4a38 + 0x28),(char *)psVar25,
                                      *(int *)((long)local_4a38 + 0x34));
                  if (iVar11 == 0) {
                    *(int *)((long)auVar38 + 0x30) = 0;
                    *(stbi_uc **)((long)auVar38 + 0xb8) = psVar25;
                    *(stbi_uc **)((long)auVar38 + 0xc0) = (stbi_uc *)((long)auVar38 + 0x38) + 1;
                    *(stbi_uc *)((long)auVar38 + 0x38) = '\0';
                  }
                  else {
                    *(stbi_uc **)((long)auVar38 + 0xb8) = psVar25;
                    *(stbi_uc **)((long)auVar38 + 0xc0) = psVar25 + iVar11;
                  }
                  pbVar27 = *(stbi_uc **)((long)auVar38 + 0xb8);
                  goto LAB_00113162;
                }
                j.nomore = 0;
              }
              auVar38 = local_4a38;
              pbVar27 = *(stbi_uc **)((long)local_4a38 + 0xb8);
              if (pbVar27 < *(stbi_uc **)((long)local_4a38 + 0xc0)) {
LAB_001131e5:
                *(byte **)((long)auVar38 + 0xb8) = pbVar27 + 1;
                j.progressive = (int)*pbVar27;
              }
              else {
                if (*(int *)((long)local_4a38 + 0x30) != 0) {
                  psVar25 = (stbi_uc *)((long)local_4a38 + 0x38);
                  iVar11 = (*((stbi_io_callbacks *)((long)local_4a38 + 0x10))->read)
                                     (*(void **)((long)local_4a38 + 0x28),(char *)psVar25,
                                      *(int *)((long)local_4a38 + 0x34));
                  if (iVar11 == 0) {
                    *(int *)((long)auVar38 + 0x30) = 0;
                    *(stbi_uc **)((long)auVar38 + 0xb8) = psVar25;
                    *(stbi_uc **)((long)auVar38 + 0xc0) = (stbi_uc *)((long)auVar38 + 0x38) + 1;
                    *(stbi_uc *)((long)auVar38 + 0x38) = '\0';
                  }
                  else {
                    *(stbi_uc **)((long)auVar38 + 0xb8) = psVar25;
                    *(stbi_uc **)((long)auVar38 + 0xc0) = psVar25 + iVar11;
                  }
                  pbVar27 = *(stbi_uc **)((long)auVar38 + 0xb8);
                  goto LAB_001131e5;
                }
                j.progressive = 0;
              }
              auVar38 = local_4a38;
              pbVar27 = *(stbi_uc **)((long)local_4a38 + 0xb8);
              if (pbVar27 < *(stbi_uc **)((long)local_4a38 + 0xc0)) {
LAB_00113268:
                *(byte **)((long)auVar38 + 0xb8) = pbVar27 + 1;
                bVar9 = *pbVar27;
              }
              else {
                if (*(int *)((long)local_4a38 + 0x30) != 0) {
                  psVar25 = (stbi_uc *)((long)local_4a38 + 0x38);
                  iVar11 = (*((stbi_io_callbacks *)((long)local_4a38 + 0x10))->read)
                                     (*(void **)((long)local_4a38 + 0x28),(char *)psVar25,
                                      *(int *)((long)local_4a38 + 0x34));
                  if (iVar11 == 0) {
                    *(int *)((long)auVar38 + 0x30) = 0;
                    *(stbi_uc **)((long)auVar38 + 0xb8) = psVar25;
                    *(stbi_uc **)((long)auVar38 + 0xc0) = (stbi_uc *)((long)auVar38 + 0x38) + 1;
                    *(stbi_uc *)((long)auVar38 + 0x38) = '\0';
                  }
                  else {
                    *(stbi_uc **)((long)auVar38 + 0xb8) = psVar25;
                    *(stbi_uc **)((long)auVar38 + 0xc0) = psVar25 + iVar11;
                  }
                  pbVar27 = *(stbi_uc **)((long)auVar38 + 0xb8);
                  goto LAB_00113268;
                }
                bVar9 = 0;
              }
              iVar11 = j.eob_run;
              j.spec_start = (uint)(bVar9 >> 4);
              j.spec_end = bVar9 & 0xf;
              if (j._18216_4_ == 0) {
                if ((j.nomore != 0) || ((0xf < bVar9 || ((bVar9 & 0xf) != 0)))) {
LAB_00114834:
                  stbi__g_failure_reason = "bad SOS";
                  goto LAB_00114d2b;
                }
                j.progressive = 0x3f;
              }
              else if ((((0x3f < j.nomore) || (0x3f < j.progressive)) || (j.progressive < j.nomore))
                      || ((0xdf < bVar9 || (0xd < (bVar9 & 0xf))))) goto LAB_00114834;
              j.order[3] = j.order[2];
              if (j.order[2] == 0) {
                j.order[3] = 0x7fffffff;
              }
              j.img_comp[3].coeff_w = 0;
              j.img_comp[3].coeff_h = 0;
              j.code_bits = 0;
              j.img_comp[2].hd = 0;
              j.img_comp[1].hd = 0;
              j.img_comp[0].hd = 0;
              j.code_buffer._0_1_ = 0xff;
              j.succ_high = 0;
              if (j._18216_4_ == 0) {
                if (j.succ_low == 1) {
                  lVar21 = (long)j.eob_run;
                  iVar12 = j.img_comp[lVar21].dc_pred + 7 >> 3;
                  if (0 < iVar12) {
                    uVar37 = j.img_comp[lVar21].ha + 7 >> 3;
                    iVar13 = 0;
                    iVar31 = 0;
                    do {
                      if (0 < (int)uVar37) {
                        pcVar52 = (code *)0x0;
                        do {
                          lVar49 = (long)j.img_comp[lVar21].tq;
                          iVar32 = stbi__jpeg_decode_block
                                             ((stbi__jpeg *)local_4a38,local_1d8,
                                              (stbi__huffman *)
                                              (j.huff_dc[(long)j.img_comp[lVar21].v + -1].delta +
                                              0xf),(stbi__huffman *)
                                                   (j.huff_ac[lVar49 + -1].delta + 0xf),
                                              j.fast_ac[lVar49 + -1] + 0x1fc,iVar11,
                                              j.dequant[(long)j.img_comp[lVar21].h + -1] + 0x38);
                          if (iVar32 == 0) {
                            bVar54 = false;
                            local_48 = (stbi__int16 *)0x0;
                          }
                          else {
                            iVar32 = j.img_comp[lVar21].x;
                            (*(code *)j._18272_8_)
                                      ((stbi_uc *)pcVar52 +
                                       (long)(iVar13 * iVar32) + *(long *)&j.img_comp[lVar21].h2,
                                       iVar32,local_1d8);
                            iVar32 = j.order[3];
                            j.order[3] = j.order[3] + -1;
                            bVar54 = true;
                            if (iVar32 < 2) {
                              if (j.img_comp[3].coeff_h < 0x18) {
                                stbi__grow_buffer_unsafe((stbi__jpeg *)local_4a38);
                              }
                              if (((byte)j.code_buffer & 0xf8) == 0xd0) {
                                j.img_comp[3].coeff_w = 0;
                                j.img_comp[3].coeff_h = 0;
                                j.code_bits = 0;
                                j.img_comp[2].hd = 0;
                                j.img_comp[1].hd = 0;
                                j.img_comp[0].hd = 0;
                                j.code_buffer._0_1_ = 0xff;
                                j.order[3] = j.order[2];
                                if (j.order[2] == 0) {
                                  j.order[3] = 0x7fffffff;
                                }
                                j.succ_high = 0;
                              }
                              else {
                                local_48 = (stbi__int16 *)0x1;
                                bVar54 = false;
                              }
                            }
                          }
                          if (!bVar54) {
                            iVar12 = (int)local_48;
                            goto LAB_0011422e;
                          }
                          pcVar52 = (code *)((stbi_uc *)pcVar52 + 8);
                        } while ((ulong)uVar37 * 8 - (long)pcVar52 != 0);
                      }
                      iVar31 = iVar31 + 1;
                      iVar13 = iVar13 + 8;
                    } while (iVar31 != iVar12);
                  }
LAB_00113e37:
                  iVar12 = 1;
                }
                else {
                  iVar12 = 1;
                  if (0 < j.img_v_max) {
                    iVar11 = 0;
                    do {
                      if (0 < j.img_h_max) {
                        iVar31 = 0;
                        do {
                          if (0 < j.succ_low) {
                            lVar21 = 0;
                            do {
                              iVar12 = j.order[lVar21 + -2];
                              local_48 = (stbi__int16 *)(long)iVar12;
                              if (0 < j.img_comp[(long)local_48].id) {
                                iVar13 = 0;
                                bVar54 = true;
                                do {
                                  uVar37 = j.img_comp[(long)((long)local_48 + -1)].coeff_h;
                                  pcVar52 = (code *)(ulong)uVar37;
                                  if (0 < (int)uVar37) {
                                    iVar32 = 0;
                                    do {
                                      iVar14 = j.img_comp[(long)local_48].id;
                                      lVar49 = (long)j.img_comp[(long)local_48].tq;
                                      iVar16 = stbi__jpeg_decode_block
                                                         ((stbi__jpeg *)local_4a38,local_1d8,
                                                          (stbi__huffman *)
                                                          (j.huff_dc[(long)j.img_comp
                                                                           [(long)local_48].v + -1].
                                                           delta + 0xf),
                                                          (stbi__huffman *)
                                                          (j.huff_ac[lVar49 + -1].delta + 0xf),
                                                          j.fast_ac[lVar49 + -1] + 0x1fc,iVar12,
                                                          j.dequant[(long)j.img_comp[(long)local_48]
                                                                          .h + -1] + 0x38);
                                      if (iVar16 == 0) {
                                        if (bVar54) goto LAB_0011421b;
                                        goto LAB_0011414d;
                                      }
                                      iVar16 = j.img_comp[(long)local_48].x;
                                      (*(code *)j._18272_8_)
                                                ((long)(((int)pcVar52 * iVar31 + iVar32) * 8) +
                                                 (long)((iVar14 * iVar11 + iVar13) * iVar16 * 8) +
                                                 *(long *)&j.img_comp[(long)local_48].h2,iVar16,
                                                 local_1d8);
                                      iVar32 = iVar32 + 1;
                                      uVar37 = j.img_comp[(long)((long)local_48 + -1)].coeff_h;
                                      pcVar52 = (code *)(ulong)uVar37;
                                    } while (iVar32 < (int)uVar37);
                                  }
                                  iVar13 = iVar13 + 1;
                                  iVar32 = j.img_comp[(long)local_48].id;
                                  bVar54 = iVar13 < iVar32;
                                } while (iVar13 < iVar32);
                              }
LAB_0011414d:
                              lVar21 = lVar21 + 1;
                            } while (lVar21 < j.succ_low);
                          }
                          iVar12 = j.order[3];
                          j.order[3] = j.order[3] + -1;
                          if (iVar12 < 2) {
                            if (j.img_comp[3].coeff_h < 0x18) {
                              stbi__grow_buffer_unsafe((stbi__jpeg *)local_4a38);
                            }
                            iVar12 = 1;
                            if (((byte)j.code_buffer & 0xf8) != 0xd0) goto LAB_0011422e;
                            j.img_comp[3].coeff_w = 0;
                            j.img_comp[3].coeff_h = 0;
                            j.code_bits = 0;
                            j.img_comp[2].hd = 0;
                            j.img_comp[1].hd = 0;
                            j.img_comp[0].hd = 0;
                            j.code_buffer._0_1_ = 0xff;
                            j.order[3] = j.order[2];
                            if (j.order[2] == 0) {
                              j.order[3] = 0x7fffffff;
                            }
                            j.succ_high = 0;
                          }
                          iVar31 = iVar31 + 1;
                        } while (iVar31 < j.img_h_max);
                      }
                      iVar11 = iVar11 + 1;
                      iVar12 = 1;
                    } while (iVar11 < j.img_v_max);
                  }
                }
              }
              else if (j.succ_low == 1) {
                lVar21 = (long)j.eob_run;
                iVar31 = j.img_comp[lVar21].dc_pred + 7 >> 3;
                iVar12 = 1;
                if (0 < iVar31) {
                  iVar13 = j.img_comp[lVar21].ha + 7 >> 3;
                  iVar12 = 0;
                  do {
                    if (0 < iVar13) {
                      iVar32 = 0;
                      psVar25 = (stbi_uc *)pcVar52;
                      do {
                        data_02 = (short *)(j.img_comp[lVar21].linebuf +
                                           (long)((*(int *)&j.img_comp[lVar21].coeff * iVar12 +
                                                  iVar32) * 0x40) * 2);
                        uVar22 = (ulong)j.nomore;
                        if (uVar22 == 0) {
                          iVar14 = stbi__jpeg_decode_block_prog_dc
                                             ((stbi__jpeg *)local_4a38,data_02,
                                              (stbi__huffman *)
                                              (j.huff_dc[(long)j.img_comp[lVar21].v + -1].delta +
                                              0xf),iVar11);
                          if (iVar14 != 0) goto LAB_00113865;
                          bVar54 = false;
                          pcVar52 = (code *)0x0;
                        }
                        else {
                          lVar49 = (long)j.img_comp[lVar21].tq;
                          bVar9 = (byte)j.spec_end;
                          if (j.spec_start == 0) {
                            if (j.succ_high == 0) {
                              local_48 = j.fast_ac[lVar49 + -1] + 0x1fc;
                              do {
                                if (j.img_comp[3].coeff_h < 0x10) {
                                  stbi__grow_buffer_unsafe((stbi__jpeg *)local_4a38);
                                }
                                uVar37 = (uint)local_48[(uint)j.img_comp[3].coeff_w >> 0x17];
                                iVar14 = (int)uVar22;
                                if (local_48[(uint)j.img_comp[3].coeff_w >> 0x17] == 0) {
                                  if (j.img_comp[3].coeff_h < 0x10) {
                                    stbi__grow_buffer_unsafe((stbi__jpeg *)local_4a38);
                                  }
                                  uVar36 = (ulong)j.huff_ac[lVar49].fast
                                                  [(ulong)((uint)j.img_comp[3].coeff_w >> 0x17) - 8]
                                  ;
                                  if (uVar36 == 0xff) {
                                    lVar41 = 0;
                                    do {
                                      lVar42 = lVar41;
                                      lVar41 = lVar42 + 1;
                                    } while (j.huff_ac[lVar49].maxcode[lVar42 + 8] <=
                                             (uint)j.img_comp[3].coeff_w >> 0x10);
                                    if (lVar41 == 8) {
                                      j.img_comp[3].coeff_h = j.img_comp[3].coeff_h + -0x10;
                                      uVar37 = 0xffffffff;
                                    }
                                    else {
                                      uVar37 = 0xffffffff;
                                      if ((int)(lVar42 + 10) <= j.img_comp[3].coeff_h) {
                                        lVar43 = (long)(int)(((uint)j.img_comp[3].coeff_w >>
                                                              (0x17U - (char)lVar41 & 0x1f) &
                                                             stbi__bmask[lVar42 + 10]) +
                                                            j.huff_ac[lVar49].delta[lVar42 + 8]);
                                        bVar29 = j.huff_ac[lVar49].size[lVar43 + -8];
                                        if (((uint)j.img_comp[3].coeff_w >> (-bVar29 & 0x1f) &
                                            stbi__bmask[bVar29]) !=
                                            (uint)j.huff_ac[lVar49].code[lVar43 + -4])
                                        goto LAB_00116ccf;
                                        j.img_comp[3].coeff_h =
                                             (j.img_comp[3].coeff_h - (int)lVar41) + -9;
                                        j.img_comp[3].coeff_w =
                                             j.img_comp[3].coeff_w << ((byte)(lVar42 + 10) & 0x1f);
                                        uVar37 = (uint)j.huff_ac[lVar49].values[lVar43 + -8];
                                      }
                                    }
                                  }
                                  else {
                                    bVar29 = j.huff_ac[lVar49].size[uVar36 - 8];
                                    uVar37 = 0xffffffff;
                                    if ((int)(uint)bVar29 <= j.img_comp[3].coeff_h) {
                                      j.img_comp[3].coeff_h = j.img_comp[3].coeff_h - (uint)bVar29;
                                      j.img_comp[3].coeff_w =
                                           j.img_comp[3].coeff_w << (bVar29 & 0x1f);
                                      uVar37 = (uint)j.huff_ac[lVar49].values[uVar36 - 8];
                                    }
                                  }
                                  if ((int)uVar37 < 0) {
                                    stbi__g_failure_reason = "bad huffman code";
                                    iVar16 = 1;
                                    bVar54 = false;
                                  }
                                  else {
                                    uVar48 = uVar37 >> 4;
                                    uVar15 = uVar37 & 0xf;
                                    if (uVar15 == 0) {
                                      if (0xef < uVar37) {
                                        uVar15 = iVar14 + 0x10;
                                        goto LAB_001139ac;
                                      }
                                      j.succ_high = 1 << ((byte)uVar48 & 0x1f);
                                      if (0xf < uVar37) {
                                        if (j.img_comp[3].coeff_h < (int)uVar48) {
                                          stbi__grow_buffer_unsafe((stbi__jpeg *)local_4a38);
                                        }
                                        bVar29 = (byte)uVar48 & 0x1f;
                                        uVar37 = j.img_comp[3].coeff_w << bVar29 |
                                                 (uint)j.img_comp[3].coeff_w >> 0x20 - bVar29;
                                        j.img_comp[3].coeff_h = j.img_comp[3].coeff_h - uVar48;
                                        j.img_comp[3].coeff_w = ~stbi__bmask[uVar48] & uVar37;
                                        j.succ_high = j.succ_high + (uVar37 & stbi__bmask[uVar48]);
                                      }
                                      j.succ_high = j.succ_high + -1;
                                      iVar16 = 2;
                                      bVar54 = false;
                                    }
                                    else {
                                      bVar29 = ""[(long)iVar14 + (ulong)uVar48];
                                      if (j.img_comp[3].coeff_h < (int)uVar15) {
                                        stbi__grow_buffer_unsafe((stbi__jpeg *)local_4a38);
                                      }
                                      iVar7 = j.img_comp[3].coeff_w;
                                      uVar35 = j.img_comp[3].coeff_w << (sbyte)uVar15 |
                                               (uint)j.img_comp[3].coeff_w >> 0x20 - (sbyte)uVar15;
                                      uVar37 = *(uint *)((long)stbi__bmask + (ulong)(uVar15 * 4));
                                      j.img_comp[3].coeff_h = j.img_comp[3].coeff_h - uVar15;
                                      j.img_comp[3].coeff_w = ~uVar37 & uVar35;
                                      iVar16 = 0;
                                      iVar40 = 0;
                                      if (-1 < iVar7) {
                                        iVar40 = *(int *)((long)stbi__jbias + (ulong)(uVar15 * 4));
                                      }
                                      uVar22 = (ulong)((int)((long)iVar14 + (ulong)uVar48) + 1);
                                      data_02[bVar29] =
                                           (short)((uVar35 & uVar37) + iVar40 << (bVar9 & 0x1f));
                                      bVar54 = true;
                                    }
                                  }
                                }
                                else {
                                  j.img_comp[3].coeff_h = j.img_comp[3].coeff_h - (uVar37 & 0xf);
                                  j.img_comp[3].coeff_w =
                                       j.img_comp[3].coeff_w << (sbyte)(uVar37 & 0xf);
                                  lVar41 = (long)iVar14 + (ulong)(uVar37 >> 4 & 0xf);
                                  uVar15 = (int)lVar41 + 1;
                                  data_02[""[lVar41]] = (short)((uVar37 >> 8) << (bVar9 & 0x1f));
LAB_001139ac:
                                  uVar22 = (ulong)uVar15;
                                  iVar16 = 0;
                                  bVar54 = true;
                                }
                                pcVar52 = (code *)0x0;
                                bVar53 = true;
                                if (iVar16 != 0) {
                                  if (iVar16 != 2) {
                                    bVar53 = bVar54;
                                  }
                                  break;
                                }
                              } while ((int)uVar22 <= j.progressive);
                            }
                            else {
                              j.succ_high = j.succ_high + -1;
                              pcVar52 = (code *)0x1;
                              bVar53 = false;
                            }
                            if (bVar53) goto LAB_00113842;
                          }
                          else {
                            if (j.succ_high == 0) {
                              uVar37 = (0x10000 << (bVar9 & 0x1f)) >> 0x10;
                              local_48 = (stbi__int16 *)(ulong)uVar37;
                              do {
                                if (j.img_comp[3].coeff_h < 0x10) {
                                  stbi__grow_buffer_unsafe((stbi__jpeg *)local_4a38);
                                }
                                uVar36 = (ulong)j.huff_ac[lVar49].fast
                                                [(ulong)((uint)j.img_comp[3].coeff_w >> 0x17) - 8];
                                if (uVar36 == 0xff) {
                                  lVar41 = 0;
                                  do {
                                    lVar42 = lVar41;
                                    lVar41 = lVar42 + 1;
                                  } while (j.huff_ac[lVar49].maxcode[lVar42 + 8] <=
                                           (uint)j.img_comp[3].coeff_w >> 0x10);
                                  if (lVar41 == 8) {
                                    j.img_comp[3].coeff_h = j.img_comp[3].coeff_h + -0x10;
                                    uVar15 = 0xffffffff;
                                  }
                                  else {
                                    uVar15 = 0xffffffff;
                                    if ((int)(lVar42 + 10) <= j.img_comp[3].coeff_h) {
                                      lVar43 = (long)(int)(((uint)j.img_comp[3].coeff_w >>
                                                            (0x17U - (char)lVar41 & 0x1f) &
                                                           stbi__bmask[lVar42 + 10]) +
                                                          j.huff_ac[lVar49].delta[lVar42 + 8]);
                                      bVar29 = j.huff_ac[lVar49].size[lVar43 + -8];
                                      if (((uint)j.img_comp[3].coeff_w >> (-bVar29 & 0x1f) &
                                          stbi__bmask[bVar29]) !=
                                          (uint)j.huff_ac[lVar49].code[lVar43 + -4]) {
LAB_00116ccf:
                                        __assert_fail(
                                                  "(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image.h"
                                                  ,0x65b,
                                                  "int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)"
                                                  );
                                      }
                                      j.img_comp[3].coeff_h =
                                           (j.img_comp[3].coeff_h - (int)lVar41) + -9;
                                      j.img_comp[3].coeff_w =
                                           j.img_comp[3].coeff_w << ((byte)(lVar42 + 10) & 0x1f);
                                      uVar15 = (uint)j.huff_ac[lVar49].values[lVar43 + -8];
                                    }
                                  }
                                }
                                else {
                                  bVar29 = j.huff_ac[lVar49].size[uVar36 - 8];
                                  uVar15 = 0xffffffff;
                                  if ((int)(uint)bVar29 <= j.img_comp[3].coeff_h) {
                                    j.img_comp[3].coeff_h = j.img_comp[3].coeff_h - (uint)bVar29;
                                    j.img_comp[3].coeff_w = j.img_comp[3].coeff_w << (bVar29 & 0x1f)
                                    ;
                                    uVar15 = (uint)j.huff_ac[lVar49].values[uVar36 - 8];
                                  }
                                }
                                if ((int)uVar15 < 0) {
LAB_00113721:
                                  stbi__g_failure_reason = "bad huffman code";
                                  bVar54 = false;
                                }
                                else {
                                  uVar48 = uVar15 >> 4;
                                  if ((uVar15 & 0xf) == 1) {
                                    if (j.img_comp[3].coeff_h < 1) {
                                      stbi__grow_buffer_unsafe((stbi__jpeg *)local_4a38);
                                    }
                                    iVar14 = j.img_comp[3].coeff_w;
                                    j.img_comp[3].coeff_h = j.img_comp[3].coeff_h + -1;
                                    j.img_comp[3].coeff_w = j.img_comp[3].coeff_w * 2;
                                    sVar46 = (short)((~iVar14 >> 0x1f | 1U) << (bVar9 & 0x1f));
                                  }
                                  else {
                                    if ((uVar15 & 0xf) != 0) goto LAB_00113721;
                                    if (uVar15 < 0xf0) {
                                      j.succ_high = ~(-1 << ((byte)uVar48 & 0x1f));
                                      uVar35 = 0x40;
                                      if (0xf < uVar15) {
                                        if (j.img_comp[3].coeff_h < (int)uVar48) {
                                          stbi__grow_buffer_unsafe((stbi__jpeg *)local_4a38);
                                        }
                                        bVar29 = (byte)uVar48 & 0x1f;
                                        uVar15 = j.img_comp[3].coeff_w << bVar29 |
                                                 (uint)j.img_comp[3].coeff_w >> 0x20 - bVar29;
                                        j.img_comp[3].coeff_h = j.img_comp[3].coeff_h - uVar48;
                                        j.img_comp[3].coeff_w = ~stbi__bmask[uVar48] & uVar15;
                                        j.succ_high = j.succ_high + (uVar15 & stbi__bmask[uVar48]);
                                      }
                                    }
                                    else {
                                      uVar35 = 0xf;
                                    }
                                    uVar48 = uVar35;
                                    sVar46 = 0;
                                  }
                                  uVar22 = (ulong)(int)uVar22;
                                  do {
                                    if ((long)j.progressive < (long)uVar22) break;
                                    bVar29 = ""[uVar22];
                                    if (data_02[bVar29] == 0) {
                                      if (uVar48 == 0) {
                                        data_02[bVar29] = sVar46;
                                        bVar54 = false;
                                        uVar48 = 0;
                                      }
                                      else {
                                        uVar48 = uVar48 - 1;
                                        bVar54 = true;
                                      }
                                    }
                                    else {
                                      if (j.img_comp[3].coeff_h < 1) {
                                        stbi__grow_buffer_unsafe((stbi__jpeg *)local_4a38);
                                      }
                                      iVar14 = j.img_comp[3].coeff_w;
                                      j.img_comp[3].coeff_h = j.img_comp[3].coeff_h + -1;
                                      j.img_comp[3].coeff_w = j.img_comp[3].coeff_w * 2;
                                      bVar54 = true;
                                      if ((iVar14 < 0) &&
                                         (sVar3 = data_02[bVar29], (uVar37 & (int)sVar3) == 0)) {
                                        uVar15 = uVar37;
                                        if (sVar3 < 1) {
                                          uVar15 = -uVar37;
                                        }
                                        data_02[bVar29] = sVar3 + (short)uVar15;
                                      }
                                    }
                                    uVar22 = uVar22 + 1;
                                  } while (bVar54);
                                  bVar54 = true;
                                }
                                if (!bVar54) {
                                  pcVar52 = (code *)0x0;
                                  goto LAB_00113847;
                                }
                              } while ((int)uVar22 <= j.progressive);
                            }
                            else {
                              j.succ_high = j.succ_high + -1;
                              if (j.nomore <= j.progressive) {
                                uVar37 = (0x10000 << (bVar9 & 0x1f)) >> 0x10;
                                do {
                                  bVar9 = ""[uVar22];
                                  if (data_02[bVar9] != 0) {
                                    if (j.img_comp[3].coeff_h < 1) {
                                      stbi__grow_buffer_unsafe((stbi__jpeg *)local_4a38);
                                    }
                                    iVar14 = j.img_comp[3].coeff_w;
                                    j.img_comp[3].coeff_h = j.img_comp[3].coeff_h + -1;
                                    j.img_comp[3].coeff_w = j.img_comp[3].coeff_w * 2;
                                    if ((iVar14 < 0) &&
                                       (sVar46 = data_02[bVar9], (uVar37 & (int)sVar46) == 0)) {
                                      uVar15 = -uVar37;
                                      if (0 < sVar46) {
                                        uVar15 = uVar37;
                                      }
                                      data_02[bVar9] = (short)uVar15 + sVar46;
                                    }
                                  }
                                  bVar54 = (long)uVar22 < (long)j.progressive;
                                  uVar22 = uVar22 + 1;
                                } while (bVar54);
                              }
                            }
LAB_00113842:
                            pcVar52 = (code *)0x1;
                          }
LAB_00113847:
                          psVar25 = (stbi_uc *)((ulong)psVar25 & 0xffffffff);
                          if ((int)pcVar52 == 0) {
                            bVar54 = false;
                          }
                          else {
LAB_00113865:
                            pcVar52 = (code *)psVar25;
                            iVar14 = j.order[3];
                            j.order[3] = j.order[3] + -1;
                            bVar54 = true;
                            if (iVar14 < 2) {
                              if (j.img_comp[3].coeff_h < 0x18) {
                                stbi__grow_buffer_unsafe((stbi__jpeg *)local_4a38);
                              }
                              if (((byte)j.code_buffer & 0xf8) == 0xd0) {
                                j.img_comp[3].coeff_w = 0;
                                j.img_comp[3].coeff_h = 0;
                                j.code_bits = 0;
                                j.img_comp[2].hd = 0;
                                j.img_comp[1].hd = 0;
                                j.img_comp[0].hd = 0;
                                j.code_buffer._0_1_ = 0xff;
                                j.order[3] = j.order[2];
                                if (j.order[2] == 0) {
                                  j.order[3] = 0x7fffffff;
                                }
                                j.succ_high = 0;
                              }
                              else {
                                pcVar52 = (code *)0x1;
                                bVar54 = false;
                              }
                            }
                          }
                        }
                        if (!bVar54) {
                          iVar12 = (int)pcVar52;
                          goto LAB_0011422e;
                        }
                        iVar32 = iVar32 + 1;
                        psVar25 = (stbi_uc *)pcVar52;
                      } while (iVar32 != iVar13);
                    }
                    iVar12 = iVar12 + 1;
                  } while (iVar12 != iVar31);
                  goto LAB_00113e37;
                }
              }
              else {
                iVar12 = 1;
                if (0 < j.img_v_max) {
                  iVar11 = 0;
                  do {
                    if (0 < j.img_h_max) {
                      pcVar52 = (code *)0x0;
                      do {
                        if (0 < j.succ_low) {
                          lVar21 = 0;
                          do {
                            iVar12 = j.order[lVar21 + -2];
                            if (0 < j.img_comp[iVar12].id) {
                              iVar31 = 0;
                              bVar54 = true;
                              do {
                                local_48 = (stbi__int16 *)CONCAT71(local_48._1_7_,bVar54);
                                iVar13 = j.img_comp[(long)iVar12 + -1].coeff_h;
                                if (0 < iVar13) {
                                  iVar32 = 0;
                                  do {
                                    iVar13 = stbi__jpeg_decode_block_prog_dc
                                                       ((stbi__jpeg *)local_4a38,
                                                        (short *)(j.img_comp[iVar12].linebuf +
                                                                 (long)((iVar13 * (int)pcVar52 +
                                                                         iVar32 + (j.img_comp
                                                                                   [iVar12].id *
                                                                                   iVar11 + iVar31)
                                                                                  * *(int *)&j.
                                                  img_comp[iVar12].coeff) * 0x40) * 2),
                                                  (stbi__huffman *)
                                                  (j.huff_dc[(long)j.img_comp[iVar12].v + -1].delta
                                                  + 0xf),iVar12);
                                    if (iVar13 == 0) {
                                      if (bVar54 != false) goto LAB_0011421b;
                                      goto LAB_00113f24;
                                    }
                                    iVar32 = iVar32 + 1;
                                    iVar13 = j.img_comp[(long)iVar12 + -1].coeff_h;
                                  } while (iVar32 < iVar13);
                                }
                                iVar31 = iVar31 + 1;
                                iVar13 = j.img_comp[iVar12].id;
                                bVar54 = iVar31 < iVar13;
                              } while (iVar31 < iVar13);
                            }
LAB_00113f24:
                            lVar21 = lVar21 + 1;
                          } while (lVar21 < j.succ_low);
                        }
                        iVar12 = j.order[3];
                        j.order[3] = j.order[3] + -1;
                        if (iVar12 < 2) {
                          if (j.img_comp[3].coeff_h < 0x18) {
                            stbi__grow_buffer_unsafe((stbi__jpeg *)local_4a38);
                          }
                          iVar12 = 1;
                          if (((byte)j.code_buffer & 0xf8) != 0xd0) goto LAB_0011422e;
                          j.img_comp[3].coeff_w = 0;
                          j.img_comp[3].coeff_h = 0;
                          j.code_bits = 0;
                          j.img_comp[2].hd = 0;
                          j.img_comp[1].hd = 0;
                          j.img_comp[0].hd = 0;
                          j.code_buffer._0_1_ = 0xff;
                          j.order[3] = j.order[2];
                          if (j.order[2] == 0) {
                            j.order[3] = 0x7fffffff;
                          }
                          j.succ_high = 0;
                        }
                        uVar37 = (int)pcVar52 + 1;
                        pcVar52 = (code *)(ulong)uVar37;
                      } while ((int)uVar37 < j.img_h_max);
                    }
                    iVar12 = 1;
                    iVar11 = iVar11 + 1;
                  } while (iVar11 < j.img_v_max);
                }
              }
              goto LAB_0011422e;
            }
            stbi__g_failure_reason = "bad SOS len";
          }
          goto LAB_00114d2b;
        }
        if (bVar9 == 0xd9) {
          if ((j._18216_4_ != 0) && (0 < *(int *)((long)local_4a38 + 8))) {
            lVar21 = 0;
            do {
              iVar11 = j.img_comp[lVar21].dc_pred + 7 >> 3;
              if (0 < iVar11) {
                uVar37 = j.img_comp[lVar21].ha + 7 >> 3;
                iVar12 = 0;
                do {
                  if (0 < (int)uVar37) {
                    uVar22 = 0;
                    do {
                      iVar13 = *(int *)&j.img_comp[lVar21].coeff * iVar12 + (int)uVar22;
                      psVar25 = j.img_comp[lVar21].linebuf;
                      iVar31 = j.img_comp[lVar21].h;
                      lVar49 = 0;
                      do {
                        *(ushort *)(psVar25 + lVar49 * 2 + (long)(iVar13 * 0x40) * 2) =
                             (ushort)j.dequant[(long)iVar31 + -1][lVar49 + 0x38] *
                             *(short *)(psVar25 + lVar49 * 2 + (long)(iVar13 * 0x40) * 2);
                        lVar49 = lVar49 + 1;
                      } while (lVar49 != 0x40);
                      (*(code *)j._18272_8_)
                                ((long)(iVar12 * 8 * j.img_comp[lVar21].x) +
                                 *(long *)&j.img_comp[lVar21].h2 + uVar22 * 8);
                      uVar22 = uVar22 + 1;
                    } while (uVar22 != uVar37);
                  }
                  iVar12 = iVar12 + 1;
                } while (iVar12 != iVar11);
              }
              lVar21 = lVar21 + 1;
            } while (lVar21 < *(int *)((long)local_4a38 + 8));
          }
          if (req_comp == 0) {
            req_comp = *(int *)((long)local_4a38 + 8);
          }
          uVar37 = *(int *)((long)local_4a38 + 8);
          uVar15 = 1;
          if (2 < req_comp) {
            uVar15 = uVar37;
          }
          if (uVar37 != 3) {
            uVar15 = uVar37;
          }
          if (0 < (int)uVar15) {
            lVar21 = 0;
            do {
              sVar4 = *(stbi__uint32 *)local_4a38;
              pvVar23 = malloc((ulong)(sVar4 + 3));
              *(void **)((long)&j.img_comp[0].raw_coeff + lVar21 * 2) = pvVar23;
              if (pvVar23 == (void *)0x0) {
                stbi__cleanup_jpeg((stbi__jpeg *)local_4a38);
                stbi__g_failure_reason = "outofmem";
              }
              else {
                uVar22 = (long)(int)j.fast_ac[3]._1016_4_ /
                         (long)*(int *)((long)j.img_comp + lVar21 * 2 + -4);
                iVar11 = (int)uVar22;
                *(int *)((long)data + lVar21 + 0x10) = iVar11;
                iVar12 = (int)j.fast_ac[3]._1020_4_ / *(int *)((long)&j.img_comp[0].id + lVar21 * 2)
                ;
                *(int *)((long)data + lVar21 + 0x14) = iVar12;
                *(int *)((long)data + lVar21 + 0x1c) = iVar12 >> 1;
                *(int *)((long)data + lVar21 + 0x18) =
                     (int)((ulong)((sVar4 + iVar11) - 1) / (uVar22 & 0xffffffff));
                *(undefined4 *)((long)data + lVar21 + 0x20) = 0;
                uVar5 = *(undefined8 *)((long)&j.img_comp[0].h2 + lVar21 * 2);
                *(undefined8 *)((long)data + lVar21 + 8) = uVar5;
                *(undefined8 *)((long)data + lVar21) = uVar5;
                if ((iVar11 == 1) && (iVar12 == 1)) {
                  *(code **)((long)local_1d8 + lVar21) = resample_row_1;
                }
                else {
                  if ((iVar11 == 1) && (iVar12 == 2)) {
                    pcVar52 = stbi__resample_row_v_2;
                  }
                  else if ((iVar11 == 2) && (iVar12 == 1)) {
                    pcVar52 = stbi__resample_row_h_2;
                  }
                  else if ((iVar11 != 2) || (pcVar52 = j.YCbCr_to_RGB_kernel, iVar12 != 2)) {
                    pcVar52 = stbi__resample_row_generic;
                  }
                  *(code **)((long)local_1d8 + lVar21) = pcVar52;
                }
              }
              if (pvVar23 == (void *)0x0) {
                return (uchar *)0x0;
              }
              lVar21 = lVar21 + 0x30;
            } while ((ulong)uVar15 * 0x30 != lVar21);
          }
          auVar38 = local_4a38;
          sVar4 = *(stbi__uint32 *)((long)local_4a38 + 4);
          puVar24 = (uchar *)malloc((ulong)(*(stbi__uint32 *)local_4a38 * req_comp * sVar4 + 1));
          if (puVar24 != (uchar *)0x0) {
            if (sVar4 != 0) {
              iVar11 = 0;
              uVar37 = 0;
              do {
                sVar4 = ((stbi__context *)auVar38)->img_x;
                if (0 < (int)uVar15) {
                  piVar39 = (int *)(data + 0x10);
                  piVar47 = &j.img_comp[0].dc_pred;
                  uVar22 = 0;
                  do {
                    iVar12 = piVar39[-1];
                    iVar31 = piVar39[-3];
                    iVar13 = iVar31 >> 1;
                    psVar25 = (stbi_uc *)
                              (**(code **)(piVar39 + -10))
                                        (*(void **)(piVar47 + 10),
                                         *(undefined8 *)
                                          ((long)piVar39 +
                                          ((ulong)(iVar13 <= iVar12) << 3 | 0xffffffffffffffe0)),
                                         *(undefined8 *)
                                          ((long)piVar39 +
                                          ((ulong)(iVar12 < iVar13) << 3 | 0xffffffffffffffe0)),
                                         piVar39[-2],piVar39[-4]);
                    coutput[uVar22 - 1] = psVar25;
                    piVar39[-1] = iVar12 + 1;
                    if (iVar31 <= iVar12 + 1) {
                      piVar39[-1] = 0;
                      *(long *)(piVar39 + -8) = *(long *)(piVar39 + -6);
                      iVar12 = *piVar39;
                      *piVar39 = iVar12 + 1;
                      if (iVar12 + 1 < *piVar47) {
                        *(long *)(piVar39 + -6) = *(long *)(piVar39 + -6) + (long)piVar47[1];
                      }
                    }
                    uVar22 = uVar22 + 1;
                    piVar47 = piVar47 + 0x18;
                    piVar39 = piVar39 + 0xc;
                  } while (uVar15 != uVar22);
                }
                if (req_comp < 3) {
                  if (req_comp == 1) {
                    if (*(stbi__uint32 *)local_4a38 != 0) {
                      uVar22 = 0;
                      do {
                        puVar24[uVar22 + sVar4 * iVar11] = *(uchar *)((long)local_118 + uVar22);
                        uVar22 = uVar22 + 1;
                      } while (uVar22 < *(stbi__uint32 *)local_4a38);
                    }
                  }
                  else if (*(stbi__uint32 *)local_4a38 != 0) {
                    uVar22 = 0;
                    do {
                      puVar24[uVar22 * 2 + (ulong)(sVar4 * iVar11)] =
                           *(uchar *)((long)local_118 + uVar22);
                      puVar24[uVar22 * 2 + (ulong)(sVar4 * iVar11) + 1] = 0xff;
                      uVar22 = uVar22 + 1;
                    } while (uVar22 < *(stbi__uint32 *)local_4a38);
                  }
                }
                else if (*(int *)((long)local_4a38 + 8) == 3) {
                  (*j.idct_block_kernel)
                            (puVar24 + uVar37 * req_comp * sVar4,(int)local_118,(short *)coutput[0])
                  ;
                }
                else if (*(stbi__uint32 *)local_4a38 != 0) {
                  puVar44 = puVar24 + (ulong)(sVar4 * iVar11) + 3;
                  uVar22 = 0;
                  do {
                    uVar2 = *(uchar *)((long)local_118 + uVar22);
                    puVar44[-1] = uVar2;
                    puVar44[-2] = uVar2;
                    puVar44[-3] = uVar2;
                    *puVar44 = 0xff;
                    uVar22 = uVar22 + 1;
                    puVar44 = puVar44 + (uint)req_comp;
                  } while (uVar22 < *(stbi__uint32 *)local_4a38);
                }
                uVar37 = uVar37 + 1;
                iVar11 = iVar11 + req_comp;
                auVar38 = local_4a38;
              } while (uVar37 < *(stbi__uint32 *)((long)local_4a38 + 4));
            }
            stbi__cleanup_jpeg((stbi__jpeg *)local_4a38);
            *x = *(stbi__uint32 *)local_4a38;
            *y = *(stbi__uint32 *)((long)local_4a38 + 4);
            if (comp != (int *)0x0) {
              *comp = *(int *)((long)local_4a38 + 8);
              return puVar24;
            }
            return puVar24;
          }
          stbi__cleanup_jpeg((stbi__jpeg *)local_4a38);
          goto LAB_001150d7;
        }
        iVar11 = stbi__process_marker((stbi__jpeg *)local_4a38,(uint)bVar9);
      } while( true );
    }
LAB_00114403:
    stbi__g_failure_reason = "bad req_comp";
    return (uchar *)0x0;
  }
  iVar11 = stbi__check_png_header(s);
  psVar25 = s->img_buffer_original;
  s->img_buffer = psVar25;
  if (iVar11 != 0) {
    if ((uint)req_comp < 5) {
      local_4a38 = (undefined1  [8])s;
      iVar11 = stbi__parse_png_file((stbi__png *)local_4a38,0,req_comp);
      puVar24 = (uchar *)j.huff_dc[0].fast._8_8_;
      auVar38 = local_4a38;
      if (iVar11 == 0) {
        puVar24 = (uchar *)0x0;
      }
      else {
        j.huff_dc[0].fast[8] = '\0';
        j.huff_dc[0].fast[9] = '\0';
        j.huff_dc[0].fast[10] = '\0';
        j.huff_dc[0].fast[0xb] = '\0';
        j.huff_dc[0].fast[0xc] = '\0';
        j.huff_dc[0].fast[0xd] = '\0';
        j.huff_dc[0].fast[0xe] = '\0';
        j.huff_dc[0].fast[0xf] = '\0';
        if ((req_comp != 0) && (*(int *)((long)local_4a38 + 0xc) != req_comp)) {
          puVar24 = stbi__convert_format
                              (puVar24,*(int *)((long)local_4a38 + 0xc),req_comp,
                               *(stbi__uint32 *)local_4a38,*(stbi__uint32 *)((long)local_4a38 + 4));
          *(int *)((long)auVar38 + 0xc) = req_comp;
          if (puVar24 == (uchar *)0x0) {
            return (uchar *)0x0;
          }
        }
        *x = *(stbi__uint32 *)local_4a38;
        *y = *(stbi__uint32 *)((long)local_4a38 + 4);
        if (comp != (int *)0x0) {
          *comp = *(int *)((long)local_4a38 + 0xc);
        }
      }
      free((void *)j.huff_dc[0].fast._8_8_);
      j.huff_dc[0].fast[8] = '\0';
      j.huff_dc[0].fast[9] = '\0';
      j.huff_dc[0].fast[10] = '\0';
      j.huff_dc[0].fast[0xb] = '\0';
      j.huff_dc[0].fast[0xc] = '\0';
      j.huff_dc[0].fast[0xd] = '\0';
      j.huff_dc[0].fast[0xe] = '\0';
      j.huff_dc[0].fast[0xf] = '\0';
      free((void *)j.huff_dc[0].fast._0_8_);
      j.huff_dc[0].fast[0] = '\0';
      j.huff_dc[0].fast[1] = '\0';
      j.huff_dc[0].fast[2] = '\0';
      j.huff_dc[0].fast[3] = '\0';
      j.huff_dc[0].fast[4] = '\0';
      j.huff_dc[0].fast[5] = '\0';
      j.huff_dc[0].fast[6] = '\0';
      j.huff_dc[0].fast[7] = '\0';
      free(j.s);
      return puVar24;
    }
    goto LAB_00114403;
  }
  if (psVar25 < s->img_buffer_end) {
LAB_0011456e:
    s->img_buffer = psVar25 + 1;
    bVar54 = true;
    if (*psVar25 == 'B') {
      psVar25 = s->img_buffer;
      if (s->img_buffer_end <= psVar25) {
        if (s->read_from_callbacks == 0) goto LAB_0011467a;
        psVar25 = s->buffer_start;
        iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar25,s->buflen);
        if (iVar11 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = psVar25;
          s->img_buffer_end = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = psVar25;
          s->img_buffer_end = psVar25 + iVar11;
        }
        psVar25 = s->img_buffer;
      }
      s->img_buffer = psVar25 + 1;
      if (*psVar25 == 'M') {
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        uVar37 = stbi__get16le(s);
        iVar11 = stbi__get16le(s);
        uVar37 = iVar11 << 0x10 | uVar37;
        if ((((0x38 < uVar37) ||
             (bVar54 = false, (0x100010000001000U >> ((ulong)uVar37 & 0x3f) & 1) == 0)) &&
            (bVar54 = false, uVar37 != 0x6c)) && (uVar37 != 0x7c)) goto LAB_00114677;
      }
    }
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar25 = s->buffer_start;
      iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar25,s->buflen);
      if (iVar11 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar25;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar25;
        s->img_buffer_end = psVar25 + iVar11;
      }
      psVar25 = s->img_buffer;
      goto LAB_0011456e;
    }
LAB_00114677:
    bVar54 = true;
  }
LAB_0011467a:
  psVar25 = s->img_buffer_original;
  s->img_buffer = psVar25;
  if (!bVar54) {
    if (s->img_buffer_end <= psVar25) {
      if (s->read_from_callbacks == 0) goto LAB_00114ea8;
      psVar25 = s->buffer_start;
      iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar25,s->buflen);
      if (iVar11 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar25;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar25;
        s->img_buffer_end = psVar25 + iVar11;
      }
      psVar25 = s->img_buffer;
    }
    s->img_buffer = psVar25 + 1;
    if (*psVar25 != 'B') {
LAB_00114ea8:
      stbi__g_failure_reason = "not BMP";
      return (uchar *)0x0;
    }
    psVar25 = s->img_buffer;
    if (s->img_buffer_end <= psVar25) {
      if (s->read_from_callbacks == 0) goto LAB_00114ea8;
      psVar25 = s->buffer_start;
      iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar25,s->buflen);
      if (iVar11 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar25;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar25;
        s->img_buffer_end = psVar25 + iVar11;
      }
      psVar25 = s->img_buffer;
    }
    s->img_buffer = psVar25 + 1;
    if (*psVar25 != 'M') goto LAB_00114ea8;
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    uVar37 = stbi__get16le(s);
    iVar11 = stbi__get16le(s);
    uVar15 = stbi__get16le(s);
    iVar12 = stbi__get16le(s);
    uVar15 = iVar12 << 0x10 | uVar15;
    if ((((0x38 < uVar15) || ((0x100010000001000U >> ((ulong)uVar15 & 0x3f) & 1) == 0)) &&
        (uVar15 != 0x6c)) && (uVar15 != 0x7c)) {
      stbi__g_failure_reason = "unknown BMP";
      return (uchar *)0x0;
    }
    uVar48 = stbi__get16le(s);
    if (uVar15 == 0xc) {
      s->img_x = uVar48;
      uVar48 = stbi__get16le(s);
    }
    else {
      iVar12 = stbi__get16le(s);
      s->img_x = iVar12 << 0x10 | uVar48;
      uVar48 = stbi__get16le(s);
      iVar12 = stbi__get16le(s);
      uVar48 = iVar12 << 0x10 | uVar48;
    }
    s->img_y = uVar48;
    iVar12 = stbi__get16le(s);
    if (iVar12 != 1) goto LAB_00116611;
    uVar48 = stbi__get16le(s);
    if (uVar48 == 1) {
      stbi__g_failure_reason = "monochrome";
      return (uchar *)0x0;
    }
    uVar37 = iVar11 << 0x10 | uVar37;
    sVar4 = s->img_y;
    sVar17 = -sVar4;
    if (0 < (int)sVar4) {
      sVar17 = sVar4;
    }
    s->img_y = sVar17;
    if (uVar15 == 0xc) {
      if (uVar48 < 0x18) {
        uVar18 = (int)(uVar37 - 0x26) / 3;
      }
      else {
        uVar18 = 0;
      }
      uVar20 = 0;
      uVar35 = 0;
      uVar51 = 0;
      uVar34 = 0;
    }
    else {
      uVar35 = stbi__get16le(s);
      iVar11 = stbi__get16le(s);
      if ((iVar11 * 0x10000 + uVar35) - 1 < 2) {
        stbi__g_failure_reason = "BMP RLE";
        return (uchar *)0x0;
      }
      stbi__get32le(s);
      stbi__get32le(s);
      stbi__get32le(s);
      stbi__get32le(s);
      stbi__get32le(s);
      if (uVar15 == 0x28) {
LAB_0011513b:
        uVar20 = 0;
        if ((uVar48 == 0x20) || (uVar48 == 0x10)) {
          uVar35 = iVar11 * 0x10000 | uVar35;
          if (uVar35 == 3) {
            uVar34 = stbi__get32le(s);
            uVar51 = stbi__get32le(s);
            uVar35 = stbi__get32le(s);
            if (uVar51 == uVar35 && uVar34 == uVar51) goto LAB_00116611;
            uVar20 = 0;
          }
          else {
            if (uVar35 != 0) {
LAB_00116611:
              stbi__g_failure_reason = "bad BMP";
              return (uchar *)0x0;
            }
            bVar54 = uVar48 != 0x20;
            uVar35 = 0x1f;
            if (!bVar54) {
              uVar35 = 0xff;
            }
            uVar51 = 0x3e0;
            if (!bVar54) {
              uVar51 = 0xff00;
            }
            uVar34 = 0x7c00;
            if (!bVar54) {
              uVar34 = 0xff0000;
            }
            uVar20 = (uint)bVar54 * 0x1000000 - 0x1000000;
          }
        }
        else {
          uVar35 = 0;
          uVar51 = 0;
          uVar34 = 0;
        }
      }
      else {
        if (uVar15 == 0x38) {
          stbi__get32le(s);
          stbi__get32le(s);
          stbi__get32le(s);
          stbi__get32le(s);
          goto LAB_0011513b;
        }
        if ((uVar15 | 0x10) != 0x7c) {
          __assert_fail("hsz == 108 || hsz == 124",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image.h"
                        ,0x1229,"stbi_uc *stbi__bmp_load(stbi__context *, int *, int *, int *, int)"
                       );
        }
        uVar34 = stbi__get32le(s);
        uVar51 = stbi__get32le(s);
        uVar35 = stbi__get32le(s);
        uVar20 = stbi__get32le(s);
        stbi__get32le(s);
        iVar11 = 0xc;
        do {
          stbi__get16le(s);
          stbi__get16le(s);
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
        if (uVar15 == 0x7c) {
          stbi__get32le(s);
          stbi__get32le(s);
          stbi__get32le(s);
          stbi__get32le(s);
        }
      }
      uVar18 = 0;
      if (uVar48 < 0x10) {
        uVar18 = (int)((uVar37 - uVar15) + -0xe) >> 2;
      }
    }
    iVar11 = 4 - (uint)(uVar20 == 0);
    s->img_n = iVar11;
    if (2 < req_comp) {
      iVar11 = req_comp;
    }
    data_00 = (stbi__context *)malloc((ulong)(s->img_x * iVar11 * s->img_y));
    if (data_00 == (stbi__context *)0x0) {
LAB_001150d7:
      stbi__g_failure_reason = "outofmem";
      return (uchar *)0x0;
    }
    if (uVar48 < 0x10) {
      if (0x100 < (int)uVar18 || uVar18 == 0) {
        free(data_00);
        stbi__g_failure_reason = "invalid";
        return (uchar *)0x0;
      }
      if (0 < (int)uVar18) {
        psVar25 = s->buffer_start;
        psVar1 = s->buffer_start + 1;
        uVar22 = 0;
        do {
          psVar26 = s->img_buffer;
          if (psVar26 < s->img_buffer_end) {
LAB_00115378:
            s->img_buffer = psVar26 + 1;
            sVar8 = *psVar26;
          }
          else {
            if (s->read_from_callbacks != 0) {
              iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar25,s->buflen);
              if (iVar12 == 0) {
                s->read_from_callbacks = 0;
                s->img_buffer = psVar25;
                s->img_buffer_end = psVar1;
                s->buffer_start[0] = '\0';
              }
              else {
                s->img_buffer = psVar25;
                s->img_buffer_end = psVar25 + iVar12;
              }
              psVar26 = s->img_buffer;
              goto LAB_00115378;
            }
            sVar8 = '\0';
          }
          j.huff_dc[0].fast[uVar22 * 4 + -0xe] = sVar8;
          psVar26 = s->img_buffer;
          if (psVar26 < s->img_buffer_end) {
LAB_001153f6:
            s->img_buffer = psVar26 + 1;
            sVar8 = *psVar26;
          }
          else {
            if (s->read_from_callbacks != 0) {
              iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar25,s->buflen);
              if (iVar12 == 0) {
                s->read_from_callbacks = 0;
                s->img_buffer = psVar25;
                s->img_buffer_end = psVar1;
                s->buffer_start[0] = '\0';
              }
              else {
                s->img_buffer = psVar25;
                s->img_buffer_end = psVar25 + iVar12;
              }
              psVar26 = s->img_buffer;
              goto LAB_001153f6;
            }
            sVar8 = '\0';
          }
          j.huff_dc[0].fast[uVar22 * 4 + -0xf] = sVar8;
          psVar26 = s->img_buffer;
          if (psVar26 < s->img_buffer_end) {
LAB_00115474:
            s->img_buffer = psVar26 + 1;
            sVar8 = *psVar26;
          }
          else {
            if (s->read_from_callbacks != 0) {
              iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar25,s->buflen);
              if (iVar12 == 0) {
                s->read_from_callbacks = 0;
                s->img_buffer = psVar25;
                s->img_buffer_end = psVar1;
                s->buffer_start[0] = '\0';
              }
              else {
                s->img_buffer = psVar25;
                s->img_buffer_end = psVar25 + iVar12;
              }
              psVar26 = s->img_buffer;
              goto LAB_00115474;
            }
            sVar8 = '\0';
          }
          j.huff_dc[0].fast[uVar22 * 4 + -0x10] = sVar8;
          if (uVar15 != 0xc) {
            psVar26 = s->img_buffer;
            if (s->img_buffer_end <= psVar26) {
              if (s->read_from_callbacks == 0) goto LAB_001154fe;
              iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar25,s->buflen);
              if (iVar12 == 0) {
                s->read_from_callbacks = 0;
                s->img_buffer = psVar25;
                s->img_buffer_end = psVar1;
                s->buffer_start[0] = '\0';
              }
              else {
                s->img_buffer = psVar25;
                s->img_buffer_end = psVar25 + iVar12;
              }
              psVar26 = s->img_buffer;
            }
            s->img_buffer = psVar26 + 1;
          }
LAB_001154fe:
          j.huff_dc[0].fast[uVar22 * 4 + -0xd] = 0xff;
          uVar22 = uVar22 + 1;
        } while (uVar18 != uVar22);
      }
      stbi__skip(s,(uVar37 - uVar15) + uVar18 * (uVar15 == 0xc | 0xfffffffc) + -0xe);
      if (uVar48 == 4) {
        uVar37 = s->img_x + 1 >> 1;
      }
      else {
        if (uVar48 != 8) {
          free(data_00);
          stbi__g_failure_reason = "bad bpp";
          return (uchar *)0x0;
        }
        uVar37 = s->img_x;
      }
      if (0 < (int)s->img_y) {
        local_78 = -uVar37 & 3;
        psVar25 = s->buffer_start;
        uVar22 = 0;
        iVar12 = 0;
        do {
          if (0 < (int)s->img_x) {
            iVar31 = 0;
            do {
              pbVar27 = s->img_buffer;
              if (pbVar27 < s->img_buffer_end) {
LAB_00116345:
                s->img_buffer = pbVar27 + 1;
                uVar37 = (uint)*pbVar27;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar25,s->buflen);
                  if (iVar13 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar25;
                    s->img_buffer_end = s->buffer_start + 1;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar25;
                    s->img_buffer_end = psVar25 + iVar13;
                  }
                  pbVar27 = s->img_buffer;
                  goto LAB_00116345;
                }
                uVar37 = 0;
              }
              uVar15 = uVar37 >> 4;
              if (uVar48 != 4) {
                uVar15 = uVar37;
              }
              uVar36 = (ulong)uVar15;
              uVar37 = uVar37 & 0xf;
              if (uVar48 != 4) {
                uVar37 = 0;
              }
              lVar21 = (long)(int)uVar22;
              uVar45 = lVar21 + 3;
              data_00->buffer_start[lVar21 + -0x38] = j.huff_dc[0].fast[uVar36 * 4 + -0x10];
              data_00->buffer_start[lVar21 + -0x37] = j.huff_dc[0].fast[uVar36 * 4 + -0xf];
              data_00->buffer_start[lVar21 + -0x36] = j.huff_dc[0].fast[uVar36 * 4 + -0xe];
              if (iVar11 == 4) {
                data_00->buffer_start[lVar21 + -0x35] = 0xff;
                uVar45 = (ulong)((int)uVar22 + 4);
              }
              sVar17 = s->img_x;
              if (iVar31 + 1U == sVar17) {
LAB_0011647f:
                uVar22 = uVar45 & 0xffffffff;
              }
              else {
                if (uVar48 == 8) {
                  pbVar27 = s->img_buffer;
                  if (s->img_buffer_end <= pbVar27) {
                    if (s->read_from_callbacks == 0) {
                      uVar37 = 0;
                      goto LAB_00116447;
                    }
                    iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar25,s->buflen);
                    if (iVar13 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar25;
                      s->img_buffer_end = s->buffer_start + 1;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar25;
                      s->img_buffer_end = psVar25 + iVar13;
                    }
                    pbVar27 = s->img_buffer;
                  }
                  s->img_buffer = pbVar27 + 1;
                  uVar37 = (uint)*pbVar27;
                }
LAB_00116447:
                lVar21 = (long)(int)uVar45;
                uVar22 = lVar21 + 3;
                uVar36 = (ulong)uVar37;
                data_00->buffer_start[lVar21 + -0x38] = j.huff_dc[0].fast[uVar36 * 4 + -0x10];
                data_00->buffer_start[lVar21 + -0x37] = j.huff_dc[0].fast[uVar36 * 4 + -0xf];
                data_00->buffer_start[lVar21 + -0x36] = j.huff_dc[0].fast[uVar36 * 4 + -0xe];
                if (iVar11 == 4) {
                  uVar45 = (ulong)((int)uVar45 + 4);
                  data_00->buffer_start[lVar21 + -0x35] = 0xff;
                  goto LAB_0011647f;
                }
              }
            } while ((iVar31 + 1U != sVar17) && (iVar31 = iVar31 + 2, iVar31 < (int)s->img_x));
          }
          stbi__skip(s,local_78);
          iVar12 = iVar12 + 1;
        } while (iVar12 < (int)s->img_y);
      }
    }
    else {
      stbi__skip(s,(uVar37 - uVar15) + -0xe);
      iVar12 = -3;
      if (uVar48 == 0x18) {
LAB_0011526c:
        local_c0 = iVar12 * s->img_x & 3;
      }
      else {
        local_c0 = 0;
        iVar12 = -2;
        if (uVar48 == 0x10) goto LAB_0011526c;
      }
      local_84 = 0;
      bVar54 = false;
      bVar53 = false;
      if (uVar48 != 0x18) {
        if (uVar48 == 0x20) {
          bVar53 = uVar20 == 0xff000000 &&
                   (uVar34 == 0xff0000 && (uVar51 == 0xff00 && uVar35 == 0xff));
          bVar54 = uVar20 != 0xff000000 ||
                   (uVar34 != 0xff0000 || (uVar51 != 0xff00 || uVar35 != 0xff));
        }
        else {
          bVar54 = true;
          bVar53 = false;
        }
      }
      local_a4 = 0;
      local_a0 = 0;
      local_bc = 0;
      local_c4 = 0;
      uVar37 = 0;
      uVar15 = 0;
      uVar18 = 0;
      if (bVar54) {
        if (((uVar35 == 0) || (uVar51 == 0)) || (uVar34 == 0)) {
          free(data_00);
          stbi__g_failure_reason = "bad masks";
          return (uchar *)0x0;
        }
        local_84 = stbi__high_bit(uVar34);
        local_84 = local_84 + -7;
        local_c4 = stbi__bitcount(uVar34);
        local_a4 = stbi__high_bit(uVar51);
        local_a4 = local_a4 + -7;
        uVar37 = stbi__bitcount(uVar51);
        local_a0 = stbi__high_bit(uVar35);
        local_a0 = local_a0 + -7;
        uVar15 = stbi__bitcount(uVar35);
        local_bc = stbi__high_bit(uVar20);
        local_bc = local_bc + -7;
        uVar18 = stbi__bitcount(uVar20);
      }
      if (0 < (int)s->img_y) {
        psVar25 = s->buffer_start;
        psVar1 = s->buffer_start + 1;
        uVar22 = 0;
        iVar12 = 0;
        do {
          uVar36 = uVar22;
          if (bVar54) {
            if (0 < (int)s->img_x) {
              iVar31 = 0;
              do {
                uVar19 = stbi__get16le(s);
                if (uVar48 != 0x10) {
                  iVar13 = stbi__get16le(s);
                  uVar19 = uVar19 | iVar13 << 0x10;
                }
                iVar13 = (int)(uVar19 & uVar34) >> ((byte)local_84 & 0x1f);
                if (local_84 < 0) {
                  iVar13 = (uVar19 & uVar34) << (-(byte)local_84 & 0x1f);
                }
                uVar33 = local_c4;
                iVar32 = iVar13;
                if (local_c4 < 8) {
                  do {
                    iVar32 = iVar32 + (iVar13 >> ((byte)uVar33 & 0x1f));
                    sVar8 = (stbi_uc)iVar32;
                    uVar33 = uVar33 + local_c4;
                  } while (uVar33 < 8);
                }
                else {
                  sVar8 = (stbi_uc)iVar13;
                }
                iVar13 = (int)(uVar19 & uVar51) >> ((byte)local_a4 & 0x1f);
                if (local_a4 < 0) {
                  iVar13 = (uVar19 & uVar51) << (-(byte)local_a4 & 0x1f);
                }
                lVar21 = (long)(int)uVar22;
                data_00->buffer_start[lVar21 + -0x38] = sVar8;
                uVar33 = uVar37;
                iVar32 = iVar13;
                if (uVar37 < 8) {
                  do {
                    iVar32 = iVar32 + (iVar13 >> ((byte)uVar33 & 0x1f));
                    sVar8 = (stbi_uc)iVar32;
                    uVar33 = uVar33 + uVar37;
                  } while (uVar33 < 8);
                }
                else {
                  sVar8 = (stbi_uc)iVar13;
                }
                iVar13 = (int)(uVar19 & uVar35) >> ((byte)local_a0 & 0x1f);
                if (local_a0 < 0) {
                  iVar13 = (uVar19 & uVar35) << (-(byte)local_a0 & 0x1f);
                }
                data_00->buffer_start[lVar21 + -0x37] = sVar8;
                uVar33 = uVar15;
                iVar32 = iVar13;
                if (uVar15 < 8) {
                  do {
                    iVar32 = iVar32 + (iVar13 >> ((byte)uVar33 & 0x1f));
                    sVar8 = (stbi_uc)iVar32;
                    uVar33 = uVar33 + uVar15;
                  } while (uVar33 < 8);
                }
                else {
                  sVar8 = (stbi_uc)iVar13;
                }
                data_00->buffer_start[lVar21 + -0x36] = sVar8;
                if (uVar20 == 0) {
                  sVar8 = 0xff;
                }
                else {
                  iVar13 = (int)(uVar19 & uVar20) >> ((byte)local_bc & 0x1f);
                  if (local_bc < 0) {
                    iVar13 = (uVar19 & uVar20) << (-(byte)local_bc & 0x1f);
                  }
                  uVar19 = uVar18;
                  iVar32 = iVar13;
                  if (uVar18 < 8) {
                    do {
                      iVar32 = iVar32 + (iVar13 >> ((byte)uVar19 & 0x1f));
                      sVar8 = (stbi_uc)iVar32;
                      uVar19 = uVar19 + uVar18;
                    } while (uVar19 < 8);
                  }
                  else {
                    sVar8 = (stbi_uc)iVar13;
                  }
                }
                uVar36 = lVar21 + 3;
                if (iVar11 == 4) {
                  data_00->buffer_start[lVar21 + -0x35] = sVar8;
                  uVar36 = (ulong)((int)uVar22 + 4);
                }
                iVar31 = iVar31 + 1;
                uVar22 = uVar36 & 0xffffffff;
              } while (iVar31 < (int)s->img_x);
            }
          }
          else if (0 < (int)s->img_x) {
            iVar31 = 0;
            do {
              psVar26 = s->img_buffer;
              if (psVar26 < s->img_buffer_end) {
LAB_0011604d:
                s->img_buffer = psVar26 + 1;
                sVar8 = *psVar26;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar25,s->buflen);
                  if (iVar13 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar25;
                    s->img_buffer_end = psVar1;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar25;
                    s->img_buffer_end = psVar25 + iVar13;
                  }
                  psVar26 = s->img_buffer;
                  goto LAB_0011604d;
                }
                sVar8 = '\0';
              }
              lVar21 = (long)(int)uVar22;
              data_00->buffer_start[lVar21 + -0x36] = sVar8;
              psVar26 = s->img_buffer;
              if (psVar26 < s->img_buffer_end) {
LAB_001160df:
                s->img_buffer = psVar26 + 1;
                sVar8 = *psVar26;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar25,s->buflen);
                  if (iVar13 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar25;
                    s->img_buffer_end = psVar1;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar25;
                    s->img_buffer_end = psVar25 + iVar13;
                  }
                  psVar26 = s->img_buffer;
                  goto LAB_001160df;
                }
                sVar8 = '\0';
              }
              data_00->buffer_start[lVar21 + -0x37] = sVar8;
              psVar26 = s->img_buffer;
              if (psVar26 < s->img_buffer_end) {
LAB_0011616e:
                s->img_buffer = psVar26 + 1;
                sVar8 = *psVar26;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar25,s->buflen);
                  if (iVar13 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar25;
                    s->img_buffer_end = psVar1;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar25;
                    s->img_buffer_end = psVar25 + iVar13;
                  }
                  psVar26 = s->img_buffer;
                  goto LAB_0011616e;
                }
                sVar8 = '\0';
              }
              data_00->buffer_start[lVar21 + -0x38] = sVar8;
              sVar8 = 0xff;
              if (bVar53) {
                psVar26 = s->img_buffer;
                if (s->img_buffer_end <= psVar26) {
                  if (s->read_from_callbacks == 0) {
                    sVar8 = '\0';
                    goto LAB_00116218;
                  }
                  iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar25,s->buflen);
                  if (iVar13 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar25;
                    s->img_buffer_end = psVar1;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar25;
                    s->img_buffer_end = psVar25 + iVar13;
                  }
                  psVar26 = s->img_buffer;
                }
                s->img_buffer = psVar26 + 1;
                sVar8 = *psVar26;
              }
LAB_00116218:
              uVar36 = lVar21 + 3;
              if (iVar11 == 4) {
                data_00->buffer_start[lVar21 + -0x35] = sVar8;
                uVar36 = (ulong)((int)uVar22 + 4);
              }
              iVar31 = iVar31 + 1;
              uVar22 = uVar36 & 0xffffffff;
            } while (iVar31 < (int)s->img_x);
          }
          stbi__skip(s,local_c0);
          iVar12 = iVar12 + 1;
          uVar22 = uVar36 & 0xffffffff;
        } while (iVar12 < (int)s->img_y);
      }
    }
    if (0 < (int)sVar4) {
      uVar37 = (int)s->img_y >> 1;
      if (0 < (int)uVar37) {
        uVar48 = s->img_x * iVar11;
        uVar15 = (s->img_y - 1) * uVar48;
        uVar22 = 0;
        uVar36 = 0;
        do {
          if (0 < (int)uVar48) {
            uVar45 = 0;
            do {
              sVar8 = data_00->buffer_start[uVar45 + uVar22 + -0x38];
              data_00->buffer_start[uVar45 + uVar22 + -0x38] =
                   data_00->buffer_start[uVar45 + uVar15 + -0x38];
              data_00->buffer_start[uVar45 + uVar15 + -0x38] = sVar8;
              uVar45 = uVar45 + 1;
            } while (uVar48 != uVar45);
          }
          uVar36 = uVar36 + 1;
          uVar15 = uVar15 - uVar48;
          uVar22 = (ulong)((int)uVar22 + uVar48);
        } while (uVar36 != uVar37);
      }
    }
    if (((req_comp != 0) && (iVar11 != req_comp)) &&
       (data_00 = (stbi__context *)
                  stbi__convert_format((uchar *)data_00,iVar11,req_comp,s->img_x,s->img_y),
       data_00 == (stbi__context *)0x0)) {
      return (uchar *)0x0;
    }
    *x = s->img_x;
    *y = s->img_y;
    if (comp == (int *)0x0) {
      return (uchar *)data_00;
    }
    local_4a38._4_4_ = s->img_n;
    y = comp;
    goto LAB_001165d5;
  }
  if (psVar25 < s->img_buffer_end) {
LAB_00114742:
    s->img_buffer = psVar25 + 1;
    if (*psVar25 == 'G') {
      psVar25 = s->img_buffer;
      if (s->img_buffer_end <= psVar25) {
        if (s->read_from_callbacks == 0) goto LAB_001155e0;
        psVar25 = s->buffer_start;
        iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar25,s->buflen);
        if (iVar11 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = psVar25;
          s->img_buffer_end = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = psVar25;
          s->img_buffer_end = psVar25 + iVar11;
        }
        psVar25 = s->img_buffer;
      }
      s->img_buffer = psVar25 + 1;
      if (*psVar25 == 'I') {
        psVar25 = s->img_buffer;
        if (s->img_buffer_end <= psVar25) {
          if (s->read_from_callbacks == 0) goto LAB_001155e0;
          psVar25 = s->buffer_start;
          iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar25,s->buflen);
          if (iVar11 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = psVar25;
            s->img_buffer_end = s->buffer_start + 1;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = psVar25;
            s->img_buffer_end = psVar25 + iVar11;
          }
          psVar25 = s->img_buffer;
        }
        s->img_buffer = psVar25 + 1;
        if (*psVar25 == 'F') {
          psVar25 = s->img_buffer;
          if (s->img_buffer_end <= psVar25) {
            if (s->read_from_callbacks == 0) goto LAB_001155e0;
            psVar25 = s->buffer_start;
            iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar25,s->buflen);
            if (iVar11 == 0) {
              s->read_from_callbacks = 0;
              s->img_buffer = psVar25;
              s->img_buffer_end = s->buffer_start + 1;
              s->buffer_start[0] = '\0';
            }
            else {
              s->img_buffer = psVar25;
              s->img_buffer_end = psVar25 + iVar11;
            }
            psVar25 = s->img_buffer;
          }
          s->img_buffer = psVar25 + 1;
          if (*psVar25 == '8') {
            psVar25 = s->img_buffer;
            if (psVar25 < s->img_buffer_end) {
LAB_00115579:
              s->img_buffer = psVar25 + 1;
              sVar8 = *psVar25;
            }
            else {
              if (s->read_from_callbacks != 0) {
                psVar25 = s->buffer_start;
                iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar25,s->buflen);
                if (iVar11 == 0) {
                  s->read_from_callbacks = 0;
                  s->img_buffer = psVar25;
                  s->img_buffer_end = s->buffer_start + 1;
                  s->buffer_start[0] = '\0';
                }
                else {
                  s->img_buffer = psVar25;
                  s->img_buffer_end = psVar25 + iVar11;
                }
                psVar25 = s->img_buffer;
                goto LAB_00115579;
              }
              sVar8 = '\0';
            }
            if ((sVar8 == '9') || (sVar8 == '7')) {
              psVar25 = s->img_buffer;
              if (s->img_buffer_end <= psVar25) {
                if (s->read_from_callbacks == 0) goto LAB_001155e0;
                psVar25 = s->buffer_start;
                iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar25,s->buflen);
                if (iVar11 == 0) {
                  s->read_from_callbacks = 0;
                  s->img_buffer = psVar25;
                  s->img_buffer_end = s->buffer_start + 1;
                  s->buffer_start[0] = '\0';
                }
                else {
                  s->img_buffer = psVar25;
                  s->img_buffer_end = psVar25 + iVar11;
                }
                psVar25 = s->img_buffer;
              }
              s->img_buffer = psVar25 + 1;
              sVar8 = *psVar25;
              s->img_buffer = s->img_buffer_original;
              if (sVar8 != 'a') goto LAB_001155ee;
              memset(local_4a38,0,0x4858);
              psVar28 = j.s;
              if (j.s == (stbi__context *)0x0) {
                iVar11 = stbi__gif_header(s,(stbi__gif *)local_4a38,comp,0);
                psVar28 = (stbi__context *)0x0;
                if (iVar11 != 0) {
                  sVar50 = (long)(int)local_4a38._4_4_ * (long)(int)local_4a38._0_4_ * 4;
                  j.s = (stbi__context *)malloc(sVar50);
                  if (j.s != (stbi__context *)0x0) {
                    if (0 < (int)sVar50) {
                      lVar21 = (long)(int)j.huff_dc[0].fast._4_4_;
                      lVar49 = 0;
                      do {
                        (j.s)->buffer_start[lVar49 + -0x38] = j.huff_dc[0].fast[lVar21 * 4 + 0x16];
                        (j.s)->buffer_start[lVar49 + -0x37] = j.huff_dc[0].fast[lVar21 * 4 + 0x15];
                        (j.s)->buffer_start[lVar49 + -0x36] = j.huff_dc[0].fast[lVar21 * 4 + 0x14];
                        (j.s)->buffer_start[lVar49 + -0x35] = j.huff_dc[0].fast[lVar21 * 4 + 0x17];
                        lVar49 = lVar49 + 4;
                      } while (lVar49 < local_4a38._0_4_ * local_4a38._4_4_ * 4);
                    }
                    goto LAB_00115940;
                  }
LAB_00116597:
                  stbi__g_failure_reason = "outofmem";
                  goto LAB_001165a5;
                }
              }
              else {
                if ((j.huff_dc[0].fast._16_4_ & 0x1c) == 0xc) {
                  sVar50 = (long)(int)local_4a38._4_4_ * (long)(int)local_4a38._0_4_ * 4;
                  j.s = (stbi__context *)malloc(sVar50);
                  if (j.s == (stbi__context *)0x0) goto LAB_00116597;
                  memcpy(j.s,psVar28,sVar50);
                }
LAB_00115940:
                psVar25 = s->buffer_start;
                psVar1 = s->buffer_start + 1;
LAB_00115948:
                psVar26 = s->img_buffer;
                if (psVar26 < s->img_buffer_end) {
LAB_001159ad:
                  s->img_buffer = psVar26 + 1;
                  sVar8 = *psVar26;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar25,s->buflen);
                    if (iVar11 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar25;
                      s->img_buffer_end = psVar1;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar25;
                      s->img_buffer_end = psVar25 + iVar11;
                    }
                    psVar26 = s->img_buffer;
                    goto LAB_001159ad;
                  }
                  sVar8 = '\0';
                }
                if (sVar8 == '!') {
                  psVar26 = s->img_buffer;
                  if (s->img_buffer_end <= psVar26) {
                    if (s->read_from_callbacks == 0) goto LAB_00115bc8;
                    iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar25,s->buflen);
                    if (iVar11 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar25;
                      s->img_buffer_end = psVar1;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar25;
                      s->img_buffer_end = psVar25 + iVar11;
                    }
                    psVar26 = s->img_buffer;
                  }
                  s->img_buffer = psVar26 + 1;
                  if (*psVar26 != 0xf9) goto LAB_00115bc8;
                  pbVar27 = s->img_buffer;
                  if (pbVar27 < s->img_buffer_end) {
LAB_00115aa0:
                    s->img_buffer = pbVar27 + 1;
                    bVar9 = *pbVar27;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar25,s->buflen);
                      if (iVar11 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar25;
                        s->img_buffer_end = psVar1;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar25;
                        s->img_buffer_end = psVar25 + iVar11;
                      }
                      pbVar27 = s->img_buffer;
                      goto LAB_00115aa0;
                    }
                    bVar9 = 0;
                  }
                  if (bVar9 == 4) {
                    pbVar27 = s->img_buffer;
                    if (pbVar27 < s->img_buffer_end) {
LAB_00115b26:
                      s->img_buffer = pbVar27 + 1;
                      j.huff_dc[0].fast._16_4_ = ZEXT14(*pbVar27);
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar25,s->buflen);
                        if (iVar11 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar25;
                          s->img_buffer_end = psVar1;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar25;
                          s->img_buffer_end = psVar25 + iVar11;
                        }
                        pbVar27 = s->img_buffer;
                        goto LAB_00115b26;
                      }
                      j.huff_dc[0].fast._16_4_ = 0;
                    }
                    stbi__get16le(s);
                    pbVar27 = s->img_buffer;
                    if (pbVar27 < s->img_buffer_end) {
LAB_00115ba7:
                      s->img_buffer = pbVar27 + 1;
                      uVar37 = (uint)*pbVar27;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar25,s->buflen);
                        if (iVar11 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar25;
                          s->img_buffer_end = psVar1;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar25;
                          s->img_buffer_end = psVar25 + iVar11;
                        }
                        pbVar27 = s->img_buffer;
                        goto LAB_00115ba7;
                      }
                      uVar37 = 0;
                    }
                    j.huff_dc[0].fast[0xc] = (char)uVar37;
                    j.huff_dc[0].fast[0xd] = (char)(uVar37 >> 8);
                    j.huff_dc[0].fast[0xe] = (char)(uVar37 >> 0x10);
                    j.huff_dc[0].fast[0xf] = (char)(uVar37 >> 0x18);
LAB_00115bc8:
                    do {
                      pbVar27 = s->img_buffer;
                      if (pbVar27 < s->img_buffer_end) {
LAB_00115c2d:
                        s->img_buffer = pbVar27 + 1;
                        bVar9 = *pbVar27;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar25,s->buflen);
                          if (iVar11 == 0) {
                            s->read_from_callbacks = 0;
                            s->img_buffer = psVar25;
                            s->img_buffer_end = psVar1;
                            s->buffer_start[0] = '\0';
                          }
                          else {
                            s->img_buffer = psVar25;
                            s->img_buffer_end = psVar25 + iVar11;
                          }
                          pbVar27 = s->img_buffer;
                          goto LAB_00115c2d;
                        }
                        bVar9 = 0;
                      }
                      if (bVar9 == 0) goto LAB_00115948;
                      stbi__skip(s,(uint)bVar9);
                    } while( true );
                  }
                  stbi__skip(s,(uint)bVar9);
                  goto LAB_00115948;
                }
                psVar28 = s;
                if (sVar8 != ';') {
                  if (sVar8 == ',') {
                    iVar11 = stbi__get16le(s);
                    iVar12 = stbi__get16le(s);
                    iVar31 = stbi__get16le(s);
                    iVar13 = stbi__get16le(s);
                    if (((int)local_4a38._0_4_ < iVar31 + iVar11) ||
                       ((int)local_4a38._4_4_ < iVar13 + iVar12)) {
                      stbi__g_failure_reason = "bad Image Descriptor";
                    }
                    else {
                      pbVar27 = s->img_buffer;
                      if (pbVar27 < s->img_buffer_end) {
LAB_001166e2:
                        s->img_buffer = pbVar27 + 1;
                        bVar9 = *pbVar27;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar25,s->buflen);
                          if (iVar11 == 0) {
                            s->read_from_callbacks = 0;
                            s->img_buffer = psVar25;
                            s->img_buffer_end = psVar1;
                            s->buffer_start[0] = '\0';
                          }
                          else {
                            s->img_buffer = psVar25;
                            s->img_buffer_end = psVar25 + iVar11;
                          }
                          pbVar27 = s->img_buffer;
                          goto LAB_001166e2;
                        }
                        bVar9 = 0;
                      }
                      if ((char)bVar9 < '\0') {
                        stbi__gif_parse_colortable
                                  (s,(stbi_uc (*) [4])(j.huff_dc[0].values + 0x14),2 << (bVar9 & 7),
                                   -(uint)((j.huff_dc[0].fast._16_4_ & 1) == 0) |
                                   j.huff_dc[0].fast._12_4_);
                      }
                      else {
                        if ((j.huff_dc[0].fast._0_8_ & 0x80) == 0) {
                          stbi__g_failure_reason = "missing color table";
                          goto LAB_001165a5;
                        }
                        lVar21 = 0;
                        do {
                          j.huff_dc[0].fast[lVar21 * 4 + 0x17] = 0xff;
                          lVar21 = lVar21 + 1;
                        } while (lVar21 != 0x100);
                        if ((-1 < (long)(int)j.huff_dc[0].fast._12_4_) &&
                           ((j.huff_dc[0].fast._16_4_ & 1) != 0)) {
                          j.huff_dc[0].fast[(long)(int)j.huff_dc[0].fast._12_4_ * 4 + 0x17] = '\0';
                        }
                      }
                      pbVar27 = s->img_buffer;
                      if (pbVar27 < s->img_buffer_end) {
LAB_00116815:
                        s->img_buffer = pbVar27 + 1;
                        bVar9 = *pbVar27;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar25,s->buflen);
                          if (iVar11 == 0) {
                            s->read_from_callbacks = 0;
                            s->img_buffer = psVar25;
                            s->img_buffer_end = psVar1;
                            s->buffer_start[0] = '\0';
                          }
                          else {
                            s->img_buffer = psVar25;
                            s->img_buffer_end = psVar25 + iVar11;
                          }
                          pbVar27 = s->img_buffer;
                          goto LAB_00116815;
                        }
                        bVar9 = 0;
                      }
                      if (bVar9 < 0xd) {
                        uVar37 = 1 << (bVar9 & 0x1f);
                        uVar22 = 0;
                        do {
                          j.huff_dc[1].code[uVar22 * 2 + -0x3e] = 0xffff;
                          *(char *)(j.huff_dc[1].code + uVar22 * 2 + -0x3d) = (char)uVar22;
                          *(char *)((long)j.huff_dc[1].code + uVar22 * 4 + -0x79) = (char)uVar22;
                          uVar22 = uVar22 + 1;
                        } while (uVar37 != uVar22);
                        uVar20 = (2 << (bVar9 & 0x1f)) - 1;
                        local_40 = 0;
                        iVar12 = 0;
                        uVar35 = 0;
                        local_58 = uVar20;
                        iVar11 = bVar9 + 1;
                        bVar54 = true;
                        uVar48 = 0xffffffff;
                        uVar15 = uVar37 + 2;
LAB_001168c8:
                        do {
                          iVar31 = iVar12 - iVar11;
                          if (iVar11 <= iVar12) {
                            bVar29 = (byte)iVar11;
                            uVar51 = uVar35 & local_58;
                            bVar53 = true;
                            bVar6 = false;
                            if (uVar51 == uVar37) {
                              uVar51 = 0xffffffff;
                              local_58 = uVar20;
                              iVar11 = bVar9 + 1;
                              uVar15 = uVar37 + 2;
                            }
                            else {
                              if (uVar51 == uVar37 + 1) {
                                do {
                                  stbi__skip(s,local_40);
                                  pbVar27 = s->img_buffer;
                                  if (pbVar27 < s->img_buffer_end) {
LAB_00116ac5:
                                    s->img_buffer = pbVar27 + 1;
                                    bVar10 = *pbVar27;
                                  }
                                  else {
                                    if (s->read_from_callbacks != 0) {
                                      iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar25,
                                                               s->buflen);
                                      if (iVar12 == 0) {
                                        s->read_from_callbacks = 0;
                                        s->img_buffer = psVar25;
                                        s->img_buffer_end = psVar1;
                                        s->buffer_start[0] = '\0';
                                      }
                                      else {
                                        s->img_buffer = psVar25;
                                        s->img_buffer_end = psVar25 + iVar12;
                                      }
                                      pbVar27 = s->img_buffer;
                                      goto LAB_00116ac5;
                                    }
                                    bVar10 = 0;
                                  }
                                  if (bVar10 == 0) goto LAB_00116b06;
                                  local_40 = (uint)bVar10;
                                } while( true );
                              }
                              if ((int)uVar15 < (int)uVar51) {
                                stbi__g_failure_reason = "illegal code in raster";
                              }
                              else if (bVar54) {
                                stbi__g_failure_reason = "no clear code";
                                bVar54 = true;
                              }
                              else {
                                if ((int)uVar48 < 0) {
                                  if (uVar51 != uVar15) goto LAB_00116c29;
                                  stbi__g_failure_reason = "illegal code in raster";
                                }
                                else {
                                  uVar34 = uVar15 + 1;
                                  if ((int)uVar15 < 0x1000) {
                                    lVar21 = (long)(int)uVar15;
                                    j.huff_dc[1].code[lVar21 * 2 + -0x3e] = (stbi__uint16)uVar48;
                                    uVar30 = (undefined1)
                                             j.huff_dc[1].code[(ulong)uVar48 * 2 + -0x3d];
                                    *(undefined1 *)(j.huff_dc[1].code + lVar21 * 2 + -0x3d) = uVar30
                                    ;
                                    if (uVar51 != uVar34) {
                                      uVar30 = (undefined1)
                                               j.huff_dc[1].code[(long)(int)uVar51 * 2 + -0x3d];
                                    }
                                    *(undefined1 *)((long)j.huff_dc[1].code + lVar21 * 4 + -0x79) =
                                         uVar30;
                                    uVar15 = uVar34;
LAB_00116c29:
                                    stbi__out_gif_code((stbi__gif *)local_4a38,(stbi__uint16)uVar51)
                                    ;
                                    bVar54 = (uVar15 & local_58) == 0;
                                    iVar12 = iVar11 + 1;
                                    if ((int)uVar15 < 0x1000 && bVar54) {
                                      iVar11 = iVar12;
                                    }
                                    if ((int)uVar15 < 0x1000 && bVar54) {
                                      local_58 = ~(-1 << ((byte)iVar12 & 0x1f));
                                    }
                                    goto LAB_00116b5e;
                                  }
                                  stbi__g_failure_reason = "too many codes";
                                  uVar15 = uVar34;
                                }
                                bVar54 = false;
                              }
                              bVar53 = false;
                              local_60 = (stbi__context *)0x0;
                              uVar51 = uVar48;
                              bVar6 = bVar54;
                            }
                            goto LAB_00116b5e;
                          }
                          if (local_40 == 0) {
                            pbVar27 = s->img_buffer;
                            if (pbVar27 < s->img_buffer_end) {
LAB_00116948:
                              s->img_buffer = pbVar27 + 1;
                              bVar29 = *pbVar27;
                            }
                            else {
                              if (s->read_from_callbacks != 0) {
                                iVar31 = (*(s->io).read)(s->io_user_data,(char *)psVar25,s->buflen);
                                if (iVar31 == 0) {
                                  s->read_from_callbacks = 0;
                                  s->img_buffer = psVar25;
                                  s->img_buffer_end = psVar1;
                                  s->buffer_start[0] = '\0';
                                }
                                else {
                                  s->img_buffer = psVar25;
                                  s->img_buffer_end = psVar25 + iVar31;
                                }
                                pbVar27 = s->img_buffer;
                                goto LAB_00116948;
                              }
                              bVar29 = 0;
                            }
                            if (bVar29 == 0) {
                              local_60 = j.s;
                              goto LAB_00116c8c;
                            }
                            local_40 = (uint)bVar29;
                          }
                          pbVar27 = s->img_buffer;
                          if (pbVar27 < s->img_buffer_end) {
LAB_001169d5:
                            s->img_buffer = pbVar27 + 1;
                            uVar51 = (uint)*pbVar27;
                          }
                          else {
                            if (s->read_from_callbacks != 0) {
                              iVar31 = (*(s->io).read)(s->io_user_data,(char *)psVar25,s->buflen);
                              if (iVar31 == 0) {
                                s->read_from_callbacks = 0;
                                s->img_buffer = psVar25;
                                s->img_buffer_end = psVar1;
                                s->buffer_start[0] = '\0';
                              }
                              else {
                                s->img_buffer = psVar25;
                                s->img_buffer_end = psVar25 + iVar31;
                              }
                              pbVar27 = s->img_buffer;
                              goto LAB_001169d5;
                            }
                            uVar51 = 0;
                          }
                          bVar29 = (byte)iVar12;
                          local_40 = local_40 - 1;
                          iVar12 = iVar12 + 8;
                          uVar35 = uVar35 | uVar51 << (bVar29 & 0x1f);
                        } while( true );
                      }
                      local_60 = (stbi__context *)0x0;
LAB_00116c8c:
                      if (local_60 != (stbi__context *)0x0) {
                        psVar28 = local_60;
                        if ((req_comp & 0xfffffffbU) != 0) {
                          psVar28 = (stbi__context *)
                                    stbi__convert_format
                                              ((uchar *)local_60,4,req_comp,local_4a38._0_4_,
                                               local_4a38._4_4_);
                        }
                        goto LAB_001165a7;
                      }
                    }
                  }
                  else {
                    stbi__g_failure_reason = "unknown code";
                  }
LAB_001165a5:
                  psVar28 = (stbi__context *)0x0;
                }
              }
LAB_001165a7:
              data_00 = (stbi__context *)0x0;
              if (psVar28 != s) {
                data_00 = psVar28;
              }
              if (data_00 == (stbi__context *)0x0) {
                return (uchar *)0x0;
              }
              *x = local_4a38._0_4_;
LAB_001165d5:
              *y = local_4a38._4_4_;
              return (uchar *)data_00;
            }
          }
        }
      }
    }
  }
  else if (s->read_from_callbacks != 0) {
    psVar25 = s->buffer_start;
    iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar25,s->buflen);
    if (iVar11 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar25;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar25;
      s->img_buffer_end = psVar25 + iVar11;
    }
    psVar25 = s->img_buffer;
    goto LAB_00114742;
  }
LAB_001155e0:
  s->img_buffer = s->img_buffer_original;
LAB_001155ee:
  iVar11 = stbi__psd_test(s);
  if (iVar11 != 0) {
    psVar25 = stbi__psd_load(s,x,y,comp,req_comp);
    return psVar25;
  }
  iVar11 = stbi__pic_test(s);
  if (iVar11 != 0) {
    psVar25 = stbi__pic_load(s,x,y,comp,req_comp);
    return psVar25;
  }
  iVar11 = stbi__pnm_test(s);
  if (iVar11 != 0) {
    psVar25 = stbi__pnm_load(s,x,y,comp,req_comp);
    return psVar25;
  }
  iVar11 = stbi__hdr_test(s);
  if (iVar11 == 0) {
    iVar11 = stbi__tga_test(s);
    if (iVar11 == 0) {
      stbi__g_failure_reason = "unknown image type";
      return (uchar *)0x0;
    }
    psVar25 = stbi__tga_load(s,x,y,comp,req_comp);
    return psVar25;
  }
  data_01 = stbi__hdr_load(s,x,y,comp,req_comp);
  if (req_comp == 0) {
    req_comp = *comp;
  }
  psVar25 = stbi__hdr_to_ldr(data_01,*x,*y,req_comp);
  return psVar25;
LAB_0011421b:
  iVar12 = 0;
LAB_0011422e:
  if (iVar12 == 0) goto LAB_00114d2b;
  if ((byte)j.code_buffer == 0xff) {
    do {
      auVar38 = local_4a38;
      if (((stbi_io_callbacks *)((long)local_4a38 + 0x10))->read ==
          (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00114266:
        if (*(stbi_uc **)((long)auVar38 + 0xc0) <= *(stbi_uc **)((long)auVar38 + 0xb8))
        goto LAB_00112e82;
      }
      else {
        iVar11 = (*((stbi_io_callbacks *)((long)local_4a38 + 0x10))->eof)
                           (*(void **)((long)local_4a38 + 0x28));
        if (iVar11 != 0) {
          if (*(int *)((long)auVar38 + 0x30) != 0) goto LAB_00114266;
          goto LAB_00112e82;
        }
      }
      auVar38 = local_4a38;
      psVar25 = *(stbi_uc **)((long)local_4a38 + 0xb8);
      if (psVar25 < *(stbi_uc **)((long)local_4a38 + 0xc0)) {
LAB_001142e9:
        *(stbi_uc **)((long)auVar38 + 0xb8) = psVar25 + 1;
        sVar8 = *psVar25;
      }
      else {
        if (*(int *)((long)local_4a38 + 0x30) != 0) {
          psVar25 = (stbi_uc *)((long)local_4a38 + 0x38);
          iVar11 = (*((stbi_io_callbacks *)((long)local_4a38 + 0x10))->read)
                             (*(void **)((long)local_4a38 + 0x28),(char *)psVar25,
                              *(int *)((long)local_4a38 + 0x34));
          if (iVar11 == 0) {
            *(int *)((long)auVar38 + 0x30) = 0;
            *(stbi_uc **)((long)auVar38 + 0xb8) = psVar25;
            *(stbi_uc **)((long)auVar38 + 0xc0) = (stbi_uc *)((long)auVar38 + 0x38) + 1;
            *(stbi_uc *)((long)auVar38 + 0x38) = '\0';
          }
          else {
            *(stbi_uc **)((long)auVar38 + 0xb8) = psVar25;
            *(stbi_uc **)((long)auVar38 + 0xc0) = psVar25 + iVar11;
          }
          psVar25 = *(stbi_uc **)((long)auVar38 + 0xb8);
          goto LAB_001142e9;
        }
        sVar8 = '\0';
      }
      auVar38 = local_4a38;
      if (sVar8 != '\0') {
        if (sVar8 == 0xff) {
          pbVar27 = *(stbi_uc **)((long)local_4a38 + 0xb8);
          if (pbVar27 < *(stbi_uc **)((long)local_4a38 + 0xc0)) {
LAB_0011438c:
            *(byte **)((long)auVar38 + 0xb8) = pbVar27 + 1;
            j.code_buffer._0_1_ = *pbVar27;
          }
          else {
            if (*(int *)((long)local_4a38 + 0x30) != 0) {
              psVar25 = (stbi_uc *)((long)local_4a38 + 0x38);
              iVar11 = (*((stbi_io_callbacks *)((long)local_4a38 + 0x10))->read)
                                 (*(void **)((long)local_4a38 + 0x28),(char *)psVar25,
                                  *(int *)((long)local_4a38 + 0x34));
              if (iVar11 == 0) {
                *(int *)((long)auVar38 + 0x30) = 0;
                *(stbi_uc **)((long)auVar38 + 0xb8) = psVar25;
                *(stbi_uc **)((long)auVar38 + 0xc0) = (stbi_uc *)((long)auVar38 + 0x38) + 1;
                *(stbi_uc *)((long)auVar38 + 0x38) = '\0';
              }
              else {
                *(stbi_uc **)((long)auVar38 + 0xb8) = psVar25;
                *(stbi_uc **)((long)auVar38 + 0xc0) = psVar25 + iVar11;
              }
              pbVar27 = *(stbi_uc **)((long)auVar38 + 0xb8);
              goto LAB_0011438c;
            }
            j.code_buffer._0_1_ = 0;
          }
          sVar8 = '\b';
        }
        else {
          stbi__g_failure_reason = "junk before marker";
          sVar8 = '\x01';
        }
      }
    } while (sVar8 == '\0');
    if (sVar8 != '\b') goto LAB_00114d2b;
  }
  goto LAB_00112e82;
LAB_00116b06:
  local_40 = 0;
  local_60 = j.s;
  bVar53 = false;
  uVar51 = uVar48;
  bVar6 = bVar54;
LAB_00116b5e:
  iVar12 = iVar31;
  uVar35 = (int)uVar35 >> (bVar29 & 0x1f);
  bVar54 = bVar6;
  uVar48 = uVar51;
  if (!bVar53) goto LAB_00116c8c;
  goto LAB_001168c8;
}

Assistant:

static unsigned char *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}